

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx512::CurveNiMBIntersector1<8>::
     intersect_t<embree::avx512::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx512::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Primitive PVar12;
  int iVar13;
  __int_type_conflict _Var14;
  long lVar15;
  RTCFilterFunctionN p_Var16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined8 uVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  byte bVar84;
  byte bVar85;
  ulong uVar86;
  uint uVar87;
  uint uVar88;
  uint uVar89;
  long lVar90;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar101 [16];
  Geometry *pGVar91;
  ulong uVar92;
  long lVar93;
  uint uVar94;
  byte bVar95;
  float fVar142;
  float fVar144;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar100 [16];
  float fVar143;
  float fVar145;
  float fVar146;
  float fVar147;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  float fVar148;
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined4 uVar149;
  undefined8 uVar150;
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar161;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar178;
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  float fVar179;
  float fVar195;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar180;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar193;
  float fVar194;
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [64];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  undefined1 auVar222 [16];
  undefined1 auVar223 [64];
  undefined1 auVar224 [64];
  undefined1 auVar225 [64];
  undefined1 auVar226 [64];
  undefined1 auVar227 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  int local_5fc;
  ulong local_5f8;
  ulong local_5f0;
  Precalculations *local_5e8;
  RTCFilterFunctionNArguments local_5e0;
  undefined1 local_5b0 [16];
  undefined8 local_5a0;
  undefined4 local_598;
  float local_594;
  undefined4 local_590;
  undefined4 local_58c;
  undefined4 local_588;
  uint local_584;
  uint local_580;
  Geometry *local_568;
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  undefined1 local_530 [8];
  undefined8 uStack_528;
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  undefined8 local_430;
  undefined8 uStack_428;
  float local_420;
  undefined4 uStack_41c;
  undefined8 uStack_418;
  Primitive *local_408;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined4 local_320;
  undefined4 uStack_31c;
  undefined4 uStack_318;
  undefined4 uStack_314;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined4 local_280;
  int local_27c;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  byte local_230;
  float local_220 [4];
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar12 = prim[1];
  uVar86 = (ulong)(byte)PVar12;
  lVar25 = uVar86 * 0x25;
  fVar175 = *(float *)(prim + lVar25 + 0x12);
  auVar151 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar25 + 6));
  fVar161 = fVar175 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar173 = fVar175 * auVar151._0_4_;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar86 * 4 + 6);
  auVar106 = vpmovsxbd_avx2(auVar96);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + uVar86 * 5 + 6);
  auVar105 = vpmovsxbd_avx2(auVar97);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar86 * 6 + 6);
  auVar117 = vpmovsxbd_avx2(auVar101);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar222._8_8_ = 0;
  auVar222._0_8_ = *(ulong *)(prim + uVar86 * 0xf + 6);
  auVar116 = vpmovsxbd_avx2(auVar222);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar12 * 0x10 + 6);
  auVar110 = vpmovsxbd_avx2(auVar7);
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar107 = vcvtdq2ps_avx(auVar110);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar12 * 0x10 + uVar86 + 6);
  auVar108 = vpmovsxbd_avx2(auVar8);
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar86 * 0x1a + 6);
  auVar115 = vpmovsxbd_avx2(auVar9);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar86 * 0x1b + 6);
  auVar109 = vpmovsxbd_avx2(auVar10);
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar86 * 0x1c + 6);
  auVar112 = vpmovsxbd_avx2(auVar11);
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar196._4_4_ = fVar161;
  auVar196._0_4_ = fVar161;
  auVar196._8_4_ = fVar161;
  auVar196._12_4_ = fVar161;
  auVar196._16_4_ = fVar161;
  auVar196._20_4_ = fVar161;
  auVar196._24_4_ = fVar161;
  auVar196._28_4_ = fVar161;
  auVar214._8_4_ = 1;
  auVar214._0_8_ = 0x100000001;
  auVar214._12_4_ = 1;
  auVar214._16_4_ = 1;
  auVar214._20_4_ = 1;
  auVar214._24_4_ = 1;
  auVar214._28_4_ = 1;
  auVar102 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar104 = ZEXT1632(CONCAT412(fVar175 * (ray->super_RayK<1>).dir.field_0.m128[3],
                                CONCAT48(fVar175 * (ray->super_RayK<1>).dir.field_0.m128[2],
                                         CONCAT44(fVar175 * (ray->super_RayK<1>).dir.field_0.m128[1]
                                                  ,fVar161))));
  auVar111 = vpermps_avx2(auVar214,auVar104);
  auVar103 = vpermps_avx512vl(auVar102,auVar104);
  fVar180 = auVar103._0_4_;
  auVar171._0_4_ = fVar180 * auVar117._0_4_;
  fVar174 = auVar103._4_4_;
  auVar171._4_4_ = fVar174 * auVar117._4_4_;
  fVar179 = auVar103._8_4_;
  auVar171._8_4_ = fVar179 * auVar117._8_4_;
  fVar193 = auVar103._12_4_;
  auVar171._12_4_ = fVar193 * auVar117._12_4_;
  fVar194 = auVar103._16_4_;
  auVar171._16_4_ = fVar194 * auVar117._16_4_;
  fVar195 = auVar103._20_4_;
  auVar171._20_4_ = fVar195 * auVar117._20_4_;
  fVar178 = auVar103._24_4_;
  auVar171._24_4_ = fVar178 * auVar117._24_4_;
  auVar171._28_4_ = 0;
  auVar104._4_4_ = auVar108._4_4_ * fVar174;
  auVar104._0_4_ = auVar108._0_4_ * fVar180;
  auVar104._8_4_ = auVar108._8_4_ * fVar179;
  auVar104._12_4_ = auVar108._12_4_ * fVar193;
  auVar104._16_4_ = auVar108._16_4_ * fVar194;
  auVar104._20_4_ = auVar108._20_4_ * fVar195;
  auVar104._24_4_ = auVar108._24_4_ * fVar178;
  auVar104._28_4_ = auVar110._28_4_;
  auVar110._4_4_ = auVar112._4_4_ * fVar174;
  auVar110._0_4_ = auVar112._0_4_ * fVar180;
  auVar110._8_4_ = auVar112._8_4_ * fVar179;
  auVar110._12_4_ = auVar112._12_4_ * fVar193;
  auVar110._16_4_ = auVar112._16_4_ * fVar194;
  auVar110._20_4_ = auVar112._20_4_ * fVar195;
  auVar110._24_4_ = auVar112._24_4_ * fVar178;
  auVar110._28_4_ = auVar103._28_4_;
  auVar96 = vfmadd231ps_fma(auVar171,auVar111,auVar105);
  auVar97 = vfmadd231ps_fma(auVar104,auVar111,auVar107);
  auVar101 = vfmadd231ps_fma(auVar110,auVar109,auVar111);
  auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar196,auVar106);
  auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar196,auVar116);
  auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar115,auVar196);
  auVar211._4_4_ = fVar173;
  auVar211._0_4_ = fVar173;
  auVar211._8_4_ = fVar173;
  auVar211._12_4_ = fVar173;
  auVar211._16_4_ = fVar173;
  auVar211._20_4_ = fVar173;
  auVar211._24_4_ = fVar173;
  auVar211._28_4_ = fVar173;
  auVar111 = ZEXT1632(CONCAT412(fVar175 * auVar151._12_4_,
                                CONCAT48(fVar175 * auVar151._8_4_,
                                         CONCAT44(fVar175 * auVar151._4_4_,fVar173))));
  auVar110 = vpermps_avx2(auVar214,auVar111);
  auVar104 = vpermps_avx512vl(auVar102,auVar111);
  fVar175 = auVar104._0_4_;
  fVar180 = auVar104._4_4_;
  auVar111._4_4_ = fVar180 * auVar117._4_4_;
  auVar111._0_4_ = fVar175 * auVar117._0_4_;
  fVar174 = auVar104._8_4_;
  auVar111._8_4_ = fVar174 * auVar117._8_4_;
  fVar179 = auVar104._12_4_;
  auVar111._12_4_ = fVar179 * auVar117._12_4_;
  fVar193 = auVar104._16_4_;
  auVar111._16_4_ = fVar193 * auVar117._16_4_;
  fVar194 = auVar104._20_4_;
  auVar111._20_4_ = fVar194 * auVar117._20_4_;
  fVar195 = auVar104._24_4_;
  auVar111._24_4_ = fVar195 * auVar117._24_4_;
  auVar111._28_4_ = fVar161;
  auVar102._4_4_ = auVar108._4_4_ * fVar180;
  auVar102._0_4_ = auVar108._0_4_ * fVar175;
  auVar102._8_4_ = auVar108._8_4_ * fVar174;
  auVar102._12_4_ = auVar108._12_4_ * fVar179;
  auVar102._16_4_ = auVar108._16_4_ * fVar193;
  auVar102._20_4_ = auVar108._20_4_ * fVar194;
  auVar102._24_4_ = auVar108._24_4_ * fVar195;
  auVar102._28_4_ = auVar117._28_4_;
  auVar108._4_4_ = auVar112._4_4_ * fVar180;
  auVar108._0_4_ = auVar112._0_4_ * fVar175;
  auVar108._8_4_ = auVar112._8_4_ * fVar174;
  auVar108._12_4_ = auVar112._12_4_ * fVar179;
  auVar108._16_4_ = auVar112._16_4_ * fVar193;
  auVar108._20_4_ = auVar112._20_4_ * fVar194;
  auVar108._24_4_ = auVar112._24_4_ * fVar195;
  auVar108._28_4_ = auVar104._28_4_;
  auVar222 = vfmadd231ps_fma(auVar111,auVar110,auVar105);
  auVar7 = vfmadd231ps_fma(auVar102,auVar110,auVar107);
  auVar8 = vfmadd231ps_fma(auVar108,auVar110,auVar109);
  auVar151 = vfmadd231ps_fma(ZEXT1632(auVar222),auVar211,auVar106);
  auVar159 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar211,auVar116);
  auVar204._8_4_ = 0x7fffffff;
  auVar204._0_8_ = 0x7fffffff7fffffff;
  auVar204._12_4_ = 0x7fffffff;
  auVar204._16_4_ = 0x7fffffff;
  auVar204._20_4_ = 0x7fffffff;
  auVar204._24_4_ = 0x7fffffff;
  auVar204._28_4_ = 0x7fffffff;
  auVar160 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar211,auVar115);
  auVar106 = vandps_avx(auVar204,ZEXT1632(auVar96));
  auVar200._8_4_ = 0x219392ef;
  auVar200._0_8_ = 0x219392ef219392ef;
  auVar200._12_4_ = 0x219392ef;
  auVar200._16_4_ = 0x219392ef;
  auVar200._20_4_ = 0x219392ef;
  auVar200._24_4_ = 0x219392ef;
  auVar200._28_4_ = 0x219392ef;
  uVar92 = vcmpps_avx512vl(auVar106,auVar200,1);
  bVar17 = (bool)((byte)uVar92 & 1);
  auVar103._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar96._0_4_;
  bVar17 = (bool)((byte)(uVar92 >> 1) & 1);
  auVar103._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar96._4_4_;
  bVar17 = (bool)((byte)(uVar92 >> 2) & 1);
  auVar103._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar96._8_4_;
  bVar17 = (bool)((byte)(uVar92 >> 3) & 1);
  auVar103._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar96._12_4_;
  auVar103._16_4_ = (uint)((byte)(uVar92 >> 4) & 1) * 0x219392ef;
  auVar103._20_4_ = (uint)((byte)(uVar92 >> 5) & 1) * 0x219392ef;
  auVar103._24_4_ = (uint)((byte)(uVar92 >> 6) & 1) * 0x219392ef;
  auVar103._28_4_ = (uint)(byte)(uVar92 >> 7) * 0x219392ef;
  auVar106 = vandps_avx(auVar204,ZEXT1632(auVar97));
  uVar92 = vcmpps_avx512vl(auVar106,auVar200,1);
  bVar17 = (bool)((byte)uVar92 & 1);
  auVar113._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar97._0_4_;
  bVar17 = (bool)((byte)(uVar92 >> 1) & 1);
  auVar113._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar97._4_4_;
  bVar17 = (bool)((byte)(uVar92 >> 2) & 1);
  auVar113._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar97._8_4_;
  bVar17 = (bool)((byte)(uVar92 >> 3) & 1);
  auVar113._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar97._12_4_;
  auVar113._16_4_ = (uint)((byte)(uVar92 >> 4) & 1) * 0x219392ef;
  auVar113._20_4_ = (uint)((byte)(uVar92 >> 5) & 1) * 0x219392ef;
  auVar113._24_4_ = (uint)((byte)(uVar92 >> 6) & 1) * 0x219392ef;
  auVar113._28_4_ = (uint)(byte)(uVar92 >> 7) * 0x219392ef;
  auVar106 = vandps_avx(auVar204,ZEXT1632(auVar101));
  uVar92 = vcmpps_avx512vl(auVar106,auVar200,1);
  bVar17 = (bool)((byte)uVar92 & 1);
  auVar106._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar101._0_4_;
  bVar17 = (bool)((byte)(uVar92 >> 1) & 1);
  auVar106._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar101._4_4_;
  bVar17 = (bool)((byte)(uVar92 >> 2) & 1);
  auVar106._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar101._8_4_;
  bVar17 = (bool)((byte)(uVar92 >> 3) & 1);
  auVar106._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar101._12_4_;
  auVar106._16_4_ = (uint)((byte)(uVar92 >> 4) & 1) * 0x219392ef;
  auVar106._20_4_ = (uint)((byte)(uVar92 >> 5) & 1) * 0x219392ef;
  auVar106._24_4_ = (uint)((byte)(uVar92 >> 6) & 1) * 0x219392ef;
  auVar106._28_4_ = (uint)(byte)(uVar92 >> 7) * 0x219392ef;
  auVar105 = vrcp14ps_avx512vl(auVar103);
  auVar201._8_4_ = 0x3f800000;
  auVar201._0_8_ = &DAT_3f8000003f800000;
  auVar201._12_4_ = 0x3f800000;
  auVar201._16_4_ = 0x3f800000;
  auVar201._20_4_ = 0x3f800000;
  auVar201._24_4_ = 0x3f800000;
  auVar201._28_4_ = 0x3f800000;
  auVar96 = vfnmadd213ps_fma(auVar103,auVar105,auVar201);
  auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar105,auVar105);
  auVar105 = vrcp14ps_avx512vl(auVar113);
  auVar97 = vfnmadd213ps_fma(auVar113,auVar105,auVar201);
  auVar97 = vfmadd132ps_fma(ZEXT1632(auVar97),auVar105,auVar105);
  auVar105 = vrcp14ps_avx512vl(auVar106);
  auVar101 = vfnmadd213ps_fma(auVar106,auVar105,auVar201);
  auVar101 = vfmadd132ps_fma(ZEXT1632(auVar101),auVar105,auVar105);
  fVar175 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar25 + 0x16)) *
            *(float *)(prim + lVar25 + 0x1a);
  auVar197._4_4_ = fVar175;
  auVar197._0_4_ = fVar175;
  auVar197._8_4_ = fVar175;
  auVar197._12_4_ = fVar175;
  auVar197._16_4_ = fVar175;
  auVar197._20_4_ = fVar175;
  auVar197._24_4_ = fVar175;
  auVar197._28_4_ = fVar175;
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar86 * 7 + 6));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar86 * 0xb + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,auVar106);
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar86 * 9 + 6));
  auVar222 = vfmadd213ps_fma(auVar105,auVar197,auVar106);
  auVar106 = vcvtdq2ps_avx(auVar117);
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar86 * 0xd + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,auVar106);
  auVar7 = vfmadd213ps_fma(auVar105,auVar197,auVar106);
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar86 * 0x12 + 6));
  auVar106 = vcvtdq2ps_avx(auVar106);
  uVar92 = (ulong)(uint)((int)(uVar86 * 5) << 2);
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar86 * 2 + uVar92 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,auVar106);
  auVar8 = vfmadd213ps_fma(auVar105,auVar197,auVar106);
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar92 + 6));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar86 * 0x18 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,auVar106);
  auVar9 = vfmadd213ps_fma(auVar105,auVar197,auVar106);
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar86 * 0x1d + 6));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar86 + (ulong)(byte)PVar12 * 0x20 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,auVar106);
  auVar10 = vfmadd213ps_fma(auVar105,auVar197,auVar106);
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar12 * 0x20 - uVar86) + 6)
                           );
  auVar106 = vcvtdq2ps_avx(auVar106);
  local_408 = prim;
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar86 * 0x23 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,auVar106);
  auVar11 = vfmadd213ps_fma(auVar105,auVar197,auVar106);
  auVar106 = vsubps_avx(ZEXT1632(auVar222),ZEXT1632(auVar151));
  auVar115._4_4_ = auVar96._4_4_ * auVar106._4_4_;
  auVar115._0_4_ = auVar96._0_4_ * auVar106._0_4_;
  auVar115._8_4_ = auVar96._8_4_ * auVar106._8_4_;
  auVar115._12_4_ = auVar96._12_4_ * auVar106._12_4_;
  auVar115._16_4_ = auVar106._16_4_ * 0.0;
  auVar115._20_4_ = auVar106._20_4_ * 0.0;
  auVar115._24_4_ = auVar106._24_4_ * 0.0;
  auVar115._28_4_ = auVar106._28_4_;
  auVar106 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar151));
  auVar172._0_4_ = auVar96._0_4_ * auVar106._0_4_;
  auVar172._4_4_ = auVar96._4_4_ * auVar106._4_4_;
  auVar172._8_4_ = auVar96._8_4_ * auVar106._8_4_;
  auVar172._12_4_ = auVar96._12_4_ * auVar106._12_4_;
  auVar172._16_4_ = auVar106._16_4_ * 0.0;
  auVar172._20_4_ = auVar106._20_4_ * 0.0;
  auVar172._24_4_ = auVar106._24_4_ * 0.0;
  auVar172._28_4_ = 0;
  auVar106 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar159));
  auVar109._4_4_ = auVar97._4_4_ * auVar106._4_4_;
  auVar109._0_4_ = auVar97._0_4_ * auVar106._0_4_;
  auVar109._8_4_ = auVar97._8_4_ * auVar106._8_4_;
  auVar109._12_4_ = auVar97._12_4_ * auVar106._12_4_;
  auVar109._16_4_ = auVar106._16_4_ * 0.0;
  auVar109._20_4_ = auVar106._20_4_ * 0.0;
  auVar109._24_4_ = auVar106._24_4_ * 0.0;
  auVar109._28_4_ = auVar106._28_4_;
  auVar106 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar159));
  auVar129._0_4_ = auVar97._0_4_ * auVar106._0_4_;
  auVar129._4_4_ = auVar97._4_4_ * auVar106._4_4_;
  auVar129._8_4_ = auVar97._8_4_ * auVar106._8_4_;
  auVar129._12_4_ = auVar97._12_4_ * auVar106._12_4_;
  auVar129._16_4_ = auVar106._16_4_ * 0.0;
  auVar129._20_4_ = auVar106._20_4_ * 0.0;
  auVar129._24_4_ = auVar106._24_4_ * 0.0;
  auVar129._28_4_ = 0;
  auVar106 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar160));
  auVar112._4_4_ = auVar101._4_4_ * auVar106._4_4_;
  auVar112._0_4_ = auVar101._0_4_ * auVar106._0_4_;
  auVar112._8_4_ = auVar101._8_4_ * auVar106._8_4_;
  auVar112._12_4_ = auVar101._12_4_ * auVar106._12_4_;
  auVar112._16_4_ = auVar106._16_4_ * 0.0;
  auVar112._20_4_ = auVar106._20_4_ * 0.0;
  auVar112._24_4_ = auVar106._24_4_ * 0.0;
  auVar112._28_4_ = auVar106._28_4_;
  auVar106 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar160));
  auVar114._0_4_ = auVar101._0_4_ * auVar106._0_4_;
  auVar114._4_4_ = auVar101._4_4_ * auVar106._4_4_;
  auVar114._8_4_ = auVar101._8_4_ * auVar106._8_4_;
  auVar114._12_4_ = auVar101._12_4_ * auVar106._12_4_;
  auVar114._16_4_ = auVar106._16_4_ * 0.0;
  auVar114._20_4_ = auVar106._20_4_ * 0.0;
  auVar114._24_4_ = auVar106._24_4_ * 0.0;
  auVar114._28_4_ = 0;
  auVar106 = vpminsd_avx2(auVar115,auVar172);
  auVar105 = vpminsd_avx2(auVar109,auVar129);
  auVar106 = vmaxps_avx(auVar106,auVar105);
  auVar105 = vpminsd_avx2(auVar112,auVar114);
  uVar149 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar117._4_4_ = uVar149;
  auVar117._0_4_ = uVar149;
  auVar117._8_4_ = uVar149;
  auVar117._12_4_ = uVar149;
  auVar117._16_4_ = uVar149;
  auVar117._20_4_ = uVar149;
  auVar117._24_4_ = uVar149;
  auVar117._28_4_ = uVar149;
  auVar105 = vmaxps_avx512vl(auVar105,auVar117);
  auVar106 = vmaxps_avx(auVar106,auVar105);
  auVar105._8_4_ = 0x3f7ffffa;
  auVar105._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar105._12_4_ = 0x3f7ffffa;
  auVar105._16_4_ = 0x3f7ffffa;
  auVar105._20_4_ = 0x3f7ffffa;
  auVar105._24_4_ = 0x3f7ffffa;
  auVar105._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar106,auVar105);
  auVar106 = vpmaxsd_avx2(auVar115,auVar172);
  auVar105 = vpmaxsd_avx2(auVar109,auVar129);
  auVar106 = vminps_avx(auVar106,auVar105);
  auVar105 = vpmaxsd_avx2(auVar112,auVar114);
  fVar175 = (ray->super_RayK<1>).tfar;
  auVar116._4_4_ = fVar175;
  auVar116._0_4_ = fVar175;
  auVar116._8_4_ = fVar175;
  auVar116._12_4_ = fVar175;
  auVar116._16_4_ = fVar175;
  auVar116._20_4_ = fVar175;
  auVar116._24_4_ = fVar175;
  auVar116._28_4_ = fVar175;
  auVar105 = vminps_avx512vl(auVar105,auVar116);
  auVar106 = vminps_avx(auVar106,auVar105);
  auVar107._8_4_ = 0x3f800003;
  auVar107._0_8_ = 0x3f8000033f800003;
  auVar107._12_4_ = 0x3f800003;
  auVar107._16_4_ = 0x3f800003;
  auVar107._20_4_ = 0x3f800003;
  auVar107._24_4_ = 0x3f800003;
  auVar107._28_4_ = 0x3f800003;
  auVar106 = vmulps_avx512vl(auVar106,auVar107);
  local_5e8 = pre;
  auVar105 = vpbroadcastd_avx512vl();
  uVar24 = vpcmpgtd_avx512vl(auVar105,_DAT_0205a920);
  uVar150 = vcmpps_avx512vl(local_80,auVar106,2);
  if ((byte)((byte)uVar150 & (byte)uVar24) != 0) {
    uVar92 = (ulong)(byte)((byte)uVar150 & (byte)uVar24);
    do {
      lVar25 = 0;
      for (uVar86 = uVar92; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      uVar94 = *(uint *)(local_408 + 2);
      uVar89 = *(uint *)(local_408 + lVar25 * 4 + 6);
      local_5f8 = (ulong)uVar94;
      pGVar91 = (context->scene->geometries).items[uVar94].ptr;
      local_5f0 = (ulong)uVar89;
      uVar86 = (ulong)*(uint *)(*(long *)&pGVar91->field_0x58 +
                               (ulong)uVar89 *
                               pGVar91[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar175 = (pGVar91->time_range).lower;
      fVar175 = pGVar91->fnumTimeSegments *
                (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar175) /
                ((pGVar91->time_range).upper - fVar175));
      auVar96 = vroundss_avx(ZEXT416((uint)fVar175),ZEXT416((uint)fVar175),9);
      auVar96 = vminss_avx(auVar96,ZEXT416((uint)(pGVar91->fnumTimeSegments + -1.0)));
      auVar96 = vmaxss_avx(ZEXT816(0) << 0x20,auVar96);
      fVar175 = fVar175 - auVar96._0_4_;
      _Var14 = pGVar91[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar90 = (long)(int)auVar96._0_4_ * 0x38;
      lVar25 = *(long *)(_Var14 + 0x10 + lVar90);
      lVar93 = *(long *)(_Var14 + 0x38 + lVar90);
      lVar15 = *(long *)(_Var14 + 0x48 + lVar90);
      auVar159._4_4_ = fVar175;
      auVar159._0_4_ = fVar175;
      auVar159._8_4_ = fVar175;
      auVar159._12_4_ = fVar175;
      pfVar3 = (float *)(lVar93 + uVar86 * lVar15);
      auVar203._0_4_ = fVar175 * *pfVar3;
      auVar203._4_4_ = fVar175 * pfVar3[1];
      auVar203._8_4_ = fVar175 * pfVar3[2];
      auVar203._12_4_ = fVar175 * pfVar3[3];
      pfVar3 = (float *)(lVar93 + (uVar86 + 1) * lVar15);
      auVar100._0_4_ = fVar175 * *pfVar3;
      auVar100._4_4_ = fVar175 * pfVar3[1];
      auVar100._8_4_ = fVar175 * pfVar3[2];
      auVar100._12_4_ = fVar175 * pfVar3[3];
      auVar96 = vmulps_avx512vl(auVar159,*(undefined1 (*) [16])(lVar93 + (uVar86 + 2) * lVar15));
      auVar97 = vmulps_avx512vl(auVar159,*(undefined1 (*) [16])(lVar93 + lVar15 * (uVar86 + 3)));
      lVar93 = *(long *)(_Var14 + lVar90);
      fVar175 = 1.0 - fVar175;
      auVar151._4_4_ = fVar175;
      auVar151._0_4_ = fVar175;
      auVar151._8_4_ = fVar175;
      auVar151._12_4_ = fVar175;
      local_5b0 = vfmadd231ps_fma(auVar203,auVar151,*(undefined1 (*) [16])(lVar93 + lVar25 * uVar86)
                                 );
      local_510 = vfmadd231ps_fma(auVar100,auVar151,
                                  *(undefined1 (*) [16])(lVar93 + lVar25 * (uVar86 + 1)));
      local_520 = vfmadd231ps_avx512vl
                            (auVar96,auVar151,*(undefined1 (*) [16])(lVar93 + lVar25 * (uVar86 + 2))
                            );
      _local_530 = vfmadd231ps_avx512vl
                             (auVar97,auVar151,
                              *(undefined1 (*) [16])(lVar93 + lVar25 * (uVar86 + 3)));
      iVar13 = (int)pGVar91[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar25 = (long)iVar13 * 0x44;
      aVar4 = (ray->super_RayK<1>).org.field_0;
      auVar97 = vsubps_avx(local_5b0,(undefined1  [16])aVar4);
      uVar149 = auVar97._0_4_;
      auVar162._4_4_ = uVar149;
      auVar162._0_4_ = uVar149;
      auVar162._8_4_ = uVar149;
      auVar162._12_4_ = uVar149;
      auVar96 = vshufps_avx(auVar97,auVar97,0x55);
      aVar5 = (local_5e8->ray_space).vx.field_0;
      aVar6 = (local_5e8->ray_space).vy.field_0;
      fVar175 = (local_5e8->ray_space).vz.field_0.m128[0];
      fVar180 = (local_5e8->ray_space).vz.field_0.m128[1];
      fVar174 = (local_5e8->ray_space).vz.field_0.m128[2];
      fVar179 = (local_5e8->ray_space).vz.field_0.m128[3];
      auVar97 = vshufps_avx(auVar97,auVar97,0xaa);
      auVar207._0_4_ = auVar97._0_4_ * fVar175;
      auVar207._4_4_ = auVar97._4_4_ * fVar180;
      auVar207._8_4_ = auVar97._8_4_ * fVar174;
      auVar207._12_4_ = auVar97._12_4_ * fVar179;
      auVar96 = vfmadd231ps_fma(auVar207,(undefined1  [16])aVar6,auVar96);
      auVar101 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar5,auVar162);
      auVar97 = vsubps_avx(local_510,(undefined1  [16])aVar4);
      uVar149 = auVar97._0_4_;
      auVar98._4_4_ = uVar149;
      auVar98._0_4_ = uVar149;
      auVar98._8_4_ = uVar149;
      auVar98._12_4_ = uVar149;
      auVar96 = vshufps_avx(auVar97,auVar97,0x55);
      auVar97 = vshufps_avx(auVar97,auVar97,0xaa);
      auVar208._0_4_ = auVar97._0_4_ * fVar175;
      auVar208._4_4_ = auVar97._4_4_ * fVar180;
      auVar208._8_4_ = auVar97._8_4_ * fVar174;
      auVar208._12_4_ = auVar97._12_4_ * fVar179;
      auVar96 = vfmadd231ps_fma(auVar208,(undefined1  [16])aVar6,auVar96);
      auVar222 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar5,auVar98);
      auVar97 = vsubps_avx512vl(local_520,(undefined1  [16])aVar4);
      uVar149 = auVar97._0_4_;
      auVar99._4_4_ = uVar149;
      auVar99._0_4_ = uVar149;
      auVar99._8_4_ = uVar149;
      auVar99._12_4_ = uVar149;
      auVar96 = vshufps_avx(auVar97,auVar97,0x55);
      auVar97 = vshufps_avx(auVar97,auVar97,0xaa);
      auVar209._0_4_ = auVar97._0_4_ * fVar175;
      auVar209._4_4_ = auVar97._4_4_ * fVar180;
      auVar209._8_4_ = auVar97._8_4_ * fVar174;
      auVar209._12_4_ = auVar97._12_4_ * fVar179;
      auVar96 = vfmadd231ps_fma(auVar209,(undefined1  [16])aVar6,auVar96);
      auVar7 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar5,auVar99);
      auVar97 = vsubps_avx512vl(_local_530,(undefined1  [16])aVar4);
      uVar149 = auVar97._0_4_;
      auVar160._4_4_ = uVar149;
      auVar160._0_4_ = uVar149;
      auVar160._8_4_ = uVar149;
      auVar160._12_4_ = uVar149;
      auVar96 = vshufps_avx(auVar97,auVar97,0x55);
      auVar97 = vshufps_avx(auVar97,auVar97,0xaa);
      auVar213._0_4_ = auVar97._0_4_ * fVar175;
      auVar213._4_4_ = auVar97._4_4_ * fVar180;
      auVar213._8_4_ = auVar97._8_4_ * fVar174;
      auVar213._12_4_ = auVar97._12_4_ * fVar179;
      auVar96 = vfmadd231ps_fma(auVar213,(undefined1  [16])aVar6,auVar96);
      auVar8 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar5,auVar160);
      auVar106 = *(undefined1 (*) [32])(bspline_basis0 + lVar25);
      uVar149 = auVar101._0_4_;
      local_360._4_4_ = uVar149;
      local_360._0_4_ = uVar149;
      local_360._8_4_ = uVar149;
      local_360._12_4_ = uVar149;
      local_360._16_4_ = uVar149;
      local_360._20_4_ = uVar149;
      local_360._24_4_ = uVar149;
      local_360._28_4_ = uVar149;
      auVar105 = *(undefined1 (*) [32])(bspline_basis0 + lVar25 + 0x484);
      auVar152._8_4_ = 1;
      auVar152._0_8_ = 0x100000001;
      auVar152._12_4_ = 1;
      auVar152._16_4_ = 1;
      auVar152._20_4_ = 1;
      auVar152._24_4_ = 1;
      auVar152._28_4_ = 1;
      local_340 = vpermps_avx2(auVar152,ZEXT1632(auVar101));
      local_380 = vbroadcastss_avx512vl(auVar222);
      local_3a0 = vpermps_avx512vl(auVar152,ZEXT1632(auVar222));
      auVar117 = *(undefined1 (*) [32])(bspline_basis0 + lVar25 + 0x908);
      local_560 = vbroadcastss_avx512vl(auVar7);
      local_480 = vpermps_avx512vl(auVar152,ZEXT1632(auVar7));
      auVar116 = *(undefined1 (*) [32])(bspline_basis0 + lVar25 + 0xd8c);
      local_4a0 = vbroadcastss_avx512vl(auVar8);
      auVar225 = ZEXT3264(local_4a0);
      local_4c0 = vpermps_avx512vl(auVar152,ZEXT1632(auVar8));
      auVar226 = ZEXT3264(local_4c0);
      auVar107 = vmulps_avx512vl(local_4a0,auVar116);
      auVar108 = vmulps_avx512vl(local_4c0,auVar116);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar117,local_560);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar117,local_480);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar105,local_380);
      auVar109 = vfmadd231ps_avx512vl(auVar108,auVar105,local_3a0);
      auVar110 = vfmadd231ps_avx512vl(auVar107,auVar106,local_360);
      auVar107 = *(undefined1 (*) [32])(bspline_basis1 + lVar25);
      auVar108 = *(undefined1 (*) [32])(bspline_basis1 + lVar25 + 0x484);
      auVar115 = *(undefined1 (*) [32])(bspline_basis1 + lVar25 + 0x908);
      auVar111 = vfmadd231ps_avx512vl(auVar109,auVar106,local_340);
      auVar109 = *(undefined1 (*) [32])(bspline_basis1 + lVar25 + 0xd8c);
      auVar112 = vmulps_avx512vl(local_4a0,auVar109);
      auVar104 = vmulps_avx512vl(local_4c0,auVar109);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar115,local_560);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar115,local_480);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar108,local_380);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar108,local_3a0);
      auVar9 = vfmadd231ps_fma(auVar112,auVar107,local_360);
      auVar10 = vfmadd231ps_fma(auVar104,auVar107,local_340);
      auVar104 = vsubps_avx512vl(ZEXT1632(auVar9),auVar110);
      auVar102 = vsubps_avx512vl(ZEXT1632(auVar10),auVar111);
      auVar112 = vmulps_avx512vl(auVar111,auVar104);
      auVar103 = vmulps_avx512vl(auVar110,auVar102);
      auVar112 = vsubps_avx512vl(auVar112,auVar103);
      auVar96 = vshufps_avx(local_5b0,local_5b0,0xff);
      uVar150 = auVar96._0_8_;
      local_a0._8_8_ = uVar150;
      local_a0._0_8_ = uVar150;
      local_a0._16_8_ = uVar150;
      local_a0._24_8_ = uVar150;
      auVar96 = vshufps_avx(local_510,local_510,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar96);
      auVar96 = vshufps_avx512vl(local_520,local_520,0xff);
      local_e0 = vbroadcastsd_avx512vl(auVar96);
      auVar96 = vshufps_avx512vl(_local_530,_local_530,0xff);
      uVar150 = auVar96._0_8_;
      register0x00001248 = uVar150;
      local_100 = uVar150;
      register0x00001250 = uVar150;
      register0x00001258 = uVar150;
      auVar103 = vmulps_avx512vl(_local_100,auVar116);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar117,local_e0);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar105,local_c0);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar106,local_a0);
      auVar113 = vmulps_avx512vl(_local_100,auVar109);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar115,local_e0);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar108,local_c0);
      auVar11 = vfmadd231ps_fma(auVar113,auVar107,local_a0);
      auVar113 = vmulps_avx512vl(auVar102,auVar102);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar104,auVar104);
      auVar114 = vmaxps_avx512vl(auVar103,ZEXT1632(auVar11));
      auVar114 = vmulps_avx512vl(auVar114,auVar114);
      auVar113 = vmulps_avx512vl(auVar114,auVar113);
      auVar112 = vmulps_avx512vl(auVar112,auVar112);
      uVar150 = vcmpps_avx512vl(auVar112,auVar113,2);
      auVar151 = local_5b0;
      auVar96 = vblendps_avx(auVar101,local_5b0,8);
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar97 = vandps_avx512vl(auVar96,auVar98);
      auVar162 = local_510;
      auVar96 = vblendps_avx(auVar222,local_510,8);
      auVar96 = vandps_avx512vl(auVar96,auVar98);
      auVar97 = vmaxps_avx(auVar97,auVar96);
      auVar160 = local_520;
      auVar96 = vblendps_avx(auVar7,local_520,8);
      auVar99 = vandps_avx512vl(auVar96,auVar98);
      auVar159 = _local_530;
      auVar96 = vblendps_avx(auVar8,_local_530,8);
      auVar96 = vandps_avx512vl(auVar96,auVar98);
      auVar96 = vmaxps_avx(auVar99,auVar96);
      auVar96 = vmaxps_avx(auVar97,auVar96);
      auVar97 = vmovshdup_avx(auVar96);
      auVar97 = vmaxss_avx(auVar97,auVar96);
      auVar96 = vshufpd_avx(auVar96,auVar96,1);
      auVar96 = vmaxss_avx(auVar96,auVar97);
      _local_300 = vcvtsi2ss_avx512f(local_520,iVar13);
      auVar205._0_4_ = local_300._0_4_;
      auVar205._4_4_ = auVar205._0_4_;
      auVar205._8_4_ = auVar205._0_4_;
      auVar205._12_4_ = auVar205._0_4_;
      auVar205._16_4_ = auVar205._0_4_;
      auVar205._20_4_ = auVar205._0_4_;
      auVar205._24_4_ = auVar205._0_4_;
      auVar205._28_4_ = auVar205._0_4_;
      uVar24 = vcmpps_avx512vl(auVar205,_DAT_02020f40,0xe);
      bVar95 = (byte)uVar150 & (byte)uVar24;
      fVar180 = auVar96._0_4_ * 4.7683716e-07;
      auVar176._8_4_ = 2;
      auVar176._0_8_ = 0x200000002;
      auVar176._12_4_ = 2;
      auVar176._16_4_ = 2;
      auVar176._20_4_ = 2;
      auVar176._24_4_ = 2;
      auVar176._28_4_ = 2;
      local_120 = vpermps_avx512vl(auVar176,ZEXT1632(auVar101));
      local_140 = vpermps_avx512vl(auVar176,ZEXT1632(auVar222));
      local_160 = vpermps_avx512vl(auVar176,ZEXT1632(auVar7));
      auVar112 = vpermps_avx2(auVar176,ZEXT1632(auVar8));
      fVar175 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      auVar96 = auVar102._0_16_;
      _local_540 = ZEXT416((uint)fVar180);
      if (bVar95 == 0) {
        auVar96 = vxorps_avx512vl(auVar96,auVar96);
        auVar223 = ZEXT1664(auVar96);
        auVar219 = ZEXT3264(local_360);
        auVar220 = ZEXT3264(local_340);
        auVar221 = ZEXT3264(local_380);
        auVar217 = ZEXT3264(local_3a0);
        auVar227 = ZEXT3264(local_560);
        auVar224 = ZEXT3264(local_480);
        local_5b0 = auVar151;
        _local_530 = auVar159;
      }
      else {
        local_400 = fVar175;
        fStack_3fc = 0.0;
        fStack_3f8 = 0.0;
        fStack_3f4 = 0.0;
        auVar109 = vmulps_avx512vl(auVar112,auVar109);
        auVar115 = vfmadd213ps_avx512vl(auVar115,local_160,auVar109);
        auVar108 = vfmadd213ps_avx512vl(auVar108,local_140,auVar115);
        auVar108 = vfmadd213ps_avx512vl(auVar107,local_120,auVar108);
        auVar116 = vmulps_avx512vl(auVar112,auVar116);
        auVar117 = vfmadd213ps_avx512vl(auVar117,local_160,auVar116);
        auVar115 = vfmadd213ps_avx512vl(auVar105,local_140,auVar117);
        auVar105 = *(undefined1 (*) [32])(bspline_basis0 + lVar25 + 0x1210);
        auVar117 = *(undefined1 (*) [32])(bspline_basis0 + lVar25 + 0x1694);
        auVar116 = *(undefined1 (*) [32])(bspline_basis0 + lVar25 + 0x1b18);
        auVar107 = *(undefined1 (*) [32])(bspline_basis0 + lVar25 + 0x1f9c);
        auVar115 = vfmadd213ps_avx512vl(auVar106,local_120,auVar115);
        auVar106 = vmulps_avx512vl(local_4a0,auVar107);
        auVar109 = vmulps_avx512vl(local_4c0,auVar107);
        auVar210._0_4_ = auVar112._0_4_ * auVar107._0_4_;
        auVar210._4_4_ = auVar112._4_4_ * auVar107._4_4_;
        auVar210._8_4_ = auVar112._8_4_ * auVar107._8_4_;
        auVar210._12_4_ = auVar112._12_4_ * auVar107._12_4_;
        auVar210._16_4_ = auVar112._16_4_ * auVar107._16_4_;
        auVar210._20_4_ = auVar112._20_4_ * auVar107._20_4_;
        auVar210._24_4_ = auVar112._24_4_ * auVar107._24_4_;
        auVar210._28_4_ = 0;
        auVar227 = ZEXT3264(local_560);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar116,local_560);
        auVar107 = vfmadd231ps_avx512vl(auVar109,auVar116,local_480);
        auVar116 = vfmadd231ps_avx512vl(auVar210,local_160,auVar116);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar117,local_380);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar117,local_3a0);
        auVar109 = vfmadd231ps_avx512vl(auVar116,local_140,auVar117);
        auVar113 = vfmadd231ps_avx512vl(auVar106,auVar105,local_360);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar105,local_340);
        auVar106 = *(undefined1 (*) [32])(bspline_basis1 + lVar25 + 0x1210);
        auVar117 = *(undefined1 (*) [32])(bspline_basis1 + lVar25 + 0x1b18);
        auVar116 = *(undefined1 (*) [32])(bspline_basis1 + lVar25 + 0x1f9c);
        auVar109 = vfmadd231ps_avx512vl(auVar109,local_120,auVar105);
        auVar105 = vmulps_avx512vl(local_4a0,auVar116);
        auVar114 = vmulps_avx512vl(local_4c0,auVar116);
        local_3e0 = auVar112;
        auVar41._4_4_ = auVar112._4_4_ * auVar116._4_4_;
        auVar41._0_4_ = auVar112._0_4_ * auVar116._0_4_;
        auVar41._8_4_ = auVar112._8_4_ * auVar116._8_4_;
        auVar41._12_4_ = auVar112._12_4_ * auVar116._12_4_;
        auVar41._16_4_ = auVar112._16_4_ * auVar116._16_4_;
        auVar41._20_4_ = auVar112._20_4_ * auVar116._20_4_;
        auVar41._24_4_ = auVar112._24_4_ * auVar116._24_4_;
        auVar41._28_4_ = auVar116._28_4_;
        auVar116 = vfmadd231ps_avx512vl(auVar105,auVar117,local_560);
        auVar114 = vfmadd231ps_avx512vl(auVar114,auVar117,local_480);
        auVar117 = vfmadd231ps_avx512vl(auVar41,local_160,auVar117);
        auVar105 = *(undefined1 (*) [32])(bspline_basis1 + lVar25 + 0x1694);
        auVar116 = vfmadd231ps_avx512vl(auVar116,auVar105,local_380);
        auVar114 = vfmadd231ps_avx512vl(auVar114,auVar105,local_3a0);
        auVar105 = vfmadd231ps_avx512vl(auVar117,local_140,auVar105);
        auVar117 = vfmadd231ps_avx512vl(auVar116,auVar106,local_360);
        auVar116 = vfmadd231ps_avx512vl(auVar114,auVar106,local_340);
        auVar114 = vfmadd231ps_avx512vl(auVar105,local_120,auVar106);
        auVar215._8_4_ = 0x7fffffff;
        auVar215._0_8_ = 0x7fffffff7fffffff;
        auVar215._12_4_ = 0x7fffffff;
        auVar215._16_4_ = 0x7fffffff;
        auVar215._20_4_ = 0x7fffffff;
        auVar215._24_4_ = 0x7fffffff;
        auVar215._28_4_ = 0x7fffffff;
        auVar106 = vandps_avx(auVar113,auVar215);
        auVar105 = vandps_avx(auVar107,auVar215);
        auVar105 = vmaxps_avx(auVar106,auVar105);
        auVar106 = vandps_avx(auVar109,auVar215);
        auVar106 = vmaxps_avx(auVar105,auVar106);
        auVar109 = vbroadcastss_avx512vl(_local_540);
        uVar86 = vcmpps_avx512vl(auVar106,auVar109,1);
        bVar17 = (bool)((byte)uVar86 & 1);
        auVar118._0_4_ = (float)((uint)bVar17 * auVar104._0_4_ | (uint)!bVar17 * auVar113._0_4_);
        bVar17 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar17 * auVar104._4_4_ | (uint)!bVar17 * auVar113._4_4_);
        bVar17 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar17 * auVar104._8_4_ | (uint)!bVar17 * auVar113._8_4_);
        bVar17 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar17 * auVar104._12_4_ | (uint)!bVar17 * auVar113._12_4_);
        bVar17 = (bool)((byte)(uVar86 >> 4) & 1);
        auVar118._16_4_ = (float)((uint)bVar17 * auVar104._16_4_ | (uint)!bVar17 * auVar113._16_4_);
        bVar17 = (bool)((byte)(uVar86 >> 5) & 1);
        auVar118._20_4_ = (float)((uint)bVar17 * auVar104._20_4_ | (uint)!bVar17 * auVar113._20_4_);
        bVar17 = (bool)((byte)(uVar86 >> 6) & 1);
        auVar118._24_4_ = (float)((uint)bVar17 * auVar104._24_4_ | (uint)!bVar17 * auVar113._24_4_);
        bVar17 = SUB81(uVar86 >> 7,0);
        auVar118._28_4_ = (uint)bVar17 * auVar104._28_4_ | (uint)!bVar17 * auVar113._28_4_;
        bVar17 = (bool)((byte)uVar86 & 1);
        auVar119._0_4_ = (float)((uint)bVar17 * auVar102._0_4_ | (uint)!bVar17 * auVar107._0_4_);
        bVar17 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar17 * auVar102._4_4_ | (uint)!bVar17 * auVar107._4_4_);
        bVar17 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar17 * auVar102._8_4_ | (uint)!bVar17 * auVar107._8_4_);
        bVar17 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar17 * auVar102._12_4_ | (uint)!bVar17 * auVar107._12_4_);
        bVar17 = (bool)((byte)(uVar86 >> 4) & 1);
        auVar119._16_4_ = (float)((uint)bVar17 * auVar102._16_4_ | (uint)!bVar17 * auVar107._16_4_);
        bVar17 = (bool)((byte)(uVar86 >> 5) & 1);
        auVar119._20_4_ = (float)((uint)bVar17 * auVar102._20_4_ | (uint)!bVar17 * auVar107._20_4_);
        bVar17 = (bool)((byte)(uVar86 >> 6) & 1);
        auVar119._24_4_ = (float)((uint)bVar17 * auVar102._24_4_ | (uint)!bVar17 * auVar107._24_4_);
        bVar17 = SUB81(uVar86 >> 7,0);
        auVar119._28_4_ = (uint)bVar17 * auVar102._28_4_ | (uint)!bVar17 * auVar107._28_4_;
        auVar106 = vandps_avx(auVar215,auVar117);
        auVar105 = vandps_avx(auVar116,auVar215);
        auVar105 = vmaxps_avx(auVar106,auVar105);
        auVar106 = vandps_avx(auVar114,auVar215);
        auVar106 = vmaxps_avx(auVar105,auVar106);
        uVar86 = vcmpps_avx512vl(auVar106,auVar109,1);
        bVar17 = (bool)((byte)uVar86 & 1);
        auVar120._0_4_ = (float)((uint)bVar17 * auVar104._0_4_ | (uint)!bVar17 * auVar117._0_4_);
        bVar17 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar120._4_4_ = (float)((uint)bVar17 * auVar104._4_4_ | (uint)!bVar17 * auVar117._4_4_);
        bVar17 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar120._8_4_ = (float)((uint)bVar17 * auVar104._8_4_ | (uint)!bVar17 * auVar117._8_4_);
        bVar17 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar120._12_4_ = (float)((uint)bVar17 * auVar104._12_4_ | (uint)!bVar17 * auVar117._12_4_);
        bVar17 = (bool)((byte)(uVar86 >> 4) & 1);
        auVar120._16_4_ = (float)((uint)bVar17 * auVar104._16_4_ | (uint)!bVar17 * auVar117._16_4_);
        bVar17 = (bool)((byte)(uVar86 >> 5) & 1);
        auVar120._20_4_ = (float)((uint)bVar17 * auVar104._20_4_ | (uint)!bVar17 * auVar117._20_4_);
        bVar17 = (bool)((byte)(uVar86 >> 6) & 1);
        auVar120._24_4_ = (float)((uint)bVar17 * auVar104._24_4_ | (uint)!bVar17 * auVar117._24_4_);
        bVar17 = SUB81(uVar86 >> 7,0);
        auVar120._28_4_ = (uint)bVar17 * auVar104._28_4_ | (uint)!bVar17 * auVar117._28_4_;
        bVar17 = (bool)((byte)uVar86 & 1);
        auVar121._0_4_ = (float)((uint)bVar17 * auVar102._0_4_ | (uint)!bVar17 * auVar116._0_4_);
        bVar17 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar121._4_4_ = (float)((uint)bVar17 * auVar102._4_4_ | (uint)!bVar17 * auVar116._4_4_);
        bVar17 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar121._8_4_ = (float)((uint)bVar17 * auVar102._8_4_ | (uint)!bVar17 * auVar116._8_4_);
        bVar17 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar121._12_4_ = (float)((uint)bVar17 * auVar102._12_4_ | (uint)!bVar17 * auVar116._12_4_);
        bVar17 = (bool)((byte)(uVar86 >> 4) & 1);
        auVar121._16_4_ = (float)((uint)bVar17 * auVar102._16_4_ | (uint)!bVar17 * auVar116._16_4_);
        bVar17 = (bool)((byte)(uVar86 >> 5) & 1);
        auVar121._20_4_ = (float)((uint)bVar17 * auVar102._20_4_ | (uint)!bVar17 * auVar116._20_4_);
        bVar17 = (bool)((byte)(uVar86 >> 6) & 1);
        auVar121._24_4_ = (float)((uint)bVar17 * auVar102._24_4_ | (uint)!bVar17 * auVar116._24_4_);
        bVar17 = SUB81(uVar86 >> 7,0);
        auVar121._28_4_ = (uint)bVar17 * auVar102._28_4_ | (uint)!bVar17 * auVar116._28_4_;
        auVar100 = vxorps_avx512vl(auVar96,auVar96);
        auVar223 = ZEXT1664(auVar100);
        auVar106 = vfmadd213ps_avx512vl(auVar118,auVar118,ZEXT1632(auVar100));
        auVar96 = vfmadd231ps_fma(auVar106,auVar119,auVar119);
        auVar106 = vrsqrt14ps_avx512vl(ZEXT1632(auVar96));
        fVar174 = auVar106._0_4_;
        fVar179 = auVar106._4_4_;
        fVar193 = auVar106._8_4_;
        fVar194 = auVar106._12_4_;
        fVar195 = auVar106._16_4_;
        fVar178 = auVar106._20_4_;
        fVar161 = auVar106._24_4_;
        auVar42._4_4_ = fVar179 * fVar179 * fVar179 * auVar96._4_4_ * -0.5;
        auVar42._0_4_ = fVar174 * fVar174 * fVar174 * auVar96._0_4_ * -0.5;
        auVar42._8_4_ = fVar193 * fVar193 * fVar193 * auVar96._8_4_ * -0.5;
        auVar42._12_4_ = fVar194 * fVar194 * fVar194 * auVar96._12_4_ * -0.5;
        auVar42._16_4_ = fVar195 * fVar195 * fVar195 * -0.0;
        auVar42._20_4_ = fVar178 * fVar178 * fVar178 * -0.0;
        auVar42._24_4_ = fVar161 * fVar161 * fVar161 * -0.0;
        auVar42._28_4_ = auVar114._28_4_;
        auVar105 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar106 = vfmadd231ps_avx512vl(auVar42,auVar105,auVar106);
        auVar43._4_4_ = auVar119._4_4_ * auVar106._4_4_;
        auVar43._0_4_ = auVar119._0_4_ * auVar106._0_4_;
        auVar43._8_4_ = auVar119._8_4_ * auVar106._8_4_;
        auVar43._12_4_ = auVar119._12_4_ * auVar106._12_4_;
        auVar43._16_4_ = auVar119._16_4_ * auVar106._16_4_;
        auVar43._20_4_ = auVar119._20_4_ * auVar106._20_4_;
        auVar43._24_4_ = auVar119._24_4_ * auVar106._24_4_;
        auVar43._28_4_ = 0;
        auVar44._4_4_ = auVar106._4_4_ * -auVar118._4_4_;
        auVar44._0_4_ = auVar106._0_4_ * -auVar118._0_4_;
        auVar44._8_4_ = auVar106._8_4_ * -auVar118._8_4_;
        auVar44._12_4_ = auVar106._12_4_ * -auVar118._12_4_;
        auVar44._16_4_ = auVar106._16_4_ * -auVar118._16_4_;
        auVar44._20_4_ = auVar106._20_4_ * -auVar118._20_4_;
        auVar44._24_4_ = auVar106._24_4_ * -auVar118._24_4_;
        auVar44._28_4_ = auVar119._28_4_;
        auVar106 = vmulps_avx512vl(auVar106,ZEXT1632(auVar100));
        auVar104 = ZEXT1632(auVar100);
        auVar117 = vfmadd213ps_avx512vl(auVar120,auVar120,auVar104);
        auVar96 = vfmadd231ps_fma(auVar117,auVar121,auVar121);
        auVar117 = vrsqrt14ps_avx512vl(ZEXT1632(auVar96));
        fVar174 = auVar117._0_4_;
        fVar179 = auVar117._4_4_;
        fVar193 = auVar117._8_4_;
        fVar194 = auVar117._12_4_;
        fVar195 = auVar117._16_4_;
        fVar178 = auVar117._20_4_;
        fVar161 = auVar117._24_4_;
        auVar45._4_4_ = fVar179 * fVar179 * fVar179 * auVar96._4_4_ * -0.5;
        auVar45._0_4_ = fVar174 * fVar174 * fVar174 * auVar96._0_4_ * -0.5;
        auVar45._8_4_ = fVar193 * fVar193 * fVar193 * auVar96._8_4_ * -0.5;
        auVar45._12_4_ = fVar194 * fVar194 * fVar194 * auVar96._12_4_ * -0.5;
        auVar45._16_4_ = fVar195 * fVar195 * fVar195 * -0.0;
        auVar45._20_4_ = fVar178 * fVar178 * fVar178 * -0.0;
        auVar45._24_4_ = fVar161 * fVar161 * fVar161 * -0.0;
        auVar45._28_4_ = 0;
        auVar105 = vfmadd231ps_avx512vl(auVar45,auVar105,auVar117);
        auVar46._4_4_ = auVar121._4_4_ * auVar105._4_4_;
        auVar46._0_4_ = auVar121._0_4_ * auVar105._0_4_;
        auVar46._8_4_ = auVar121._8_4_ * auVar105._8_4_;
        auVar46._12_4_ = auVar121._12_4_ * auVar105._12_4_;
        auVar46._16_4_ = auVar121._16_4_ * auVar105._16_4_;
        auVar46._20_4_ = auVar121._20_4_ * auVar105._20_4_;
        auVar46._24_4_ = auVar121._24_4_ * auVar105._24_4_;
        auVar46._28_4_ = auVar117._28_4_;
        auVar47._4_4_ = -auVar120._4_4_ * auVar105._4_4_;
        auVar47._0_4_ = -auVar120._0_4_ * auVar105._0_4_;
        auVar47._8_4_ = -auVar120._8_4_ * auVar105._8_4_;
        auVar47._12_4_ = -auVar120._12_4_ * auVar105._12_4_;
        auVar47._16_4_ = -auVar120._16_4_ * auVar105._16_4_;
        auVar47._20_4_ = -auVar120._20_4_ * auVar105._20_4_;
        auVar47._24_4_ = -auVar120._24_4_ * auVar105._24_4_;
        auVar47._28_4_ = auVar120._28_4_ ^ 0x80000000;
        auVar105 = vmulps_avx512vl(auVar105,auVar104);
        auVar96 = vfmadd213ps_fma(auVar43,auVar103,auVar110);
        auVar97 = vfmadd213ps_fma(auVar44,auVar103,auVar111);
        auVar117 = vfmadd213ps_avx512vl(auVar106,auVar103,auVar115);
        auVar116 = vfmadd213ps_avx512vl(auVar46,ZEXT1632(auVar11),ZEXT1632(auVar9));
        auVar98 = vfnmadd213ps_fma(auVar43,auVar103,auVar110);
        auVar109 = ZEXT1632(auVar11);
        auVar101 = vfmadd213ps_fma(auVar47,auVar109,ZEXT1632(auVar10));
        auVar99 = vfnmadd213ps_fma(auVar44,auVar103,auVar111);
        auVar222 = vfmadd213ps_fma(auVar105,auVar109,auVar108);
        auVar107 = vfnmadd231ps_avx512vl(auVar115,auVar103,auVar106);
        auVar9 = vfnmadd213ps_fma(auVar46,auVar109,ZEXT1632(auVar9));
        auVar10 = vfnmadd213ps_fma(auVar47,auVar109,ZEXT1632(auVar10));
        auVar203 = vfnmadd231ps_fma(auVar108,ZEXT1632(auVar11),auVar105);
        auVar105 = vsubps_avx512vl(auVar116,ZEXT1632(auVar98));
        auVar106 = vsubps_avx(ZEXT1632(auVar101),ZEXT1632(auVar99));
        auVar108 = vsubps_avx512vl(ZEXT1632(auVar222),auVar107);
        auVar115 = vmulps_avx512vl(auVar106,auVar107);
        auVar7 = vfmsub231ps_fma(auVar115,ZEXT1632(auVar99),auVar108);
        auVar48._4_4_ = auVar98._4_4_ * auVar108._4_4_;
        auVar48._0_4_ = auVar98._0_4_ * auVar108._0_4_;
        auVar48._8_4_ = auVar98._8_4_ * auVar108._8_4_;
        auVar48._12_4_ = auVar98._12_4_ * auVar108._12_4_;
        auVar48._16_4_ = auVar108._16_4_ * 0.0;
        auVar48._20_4_ = auVar108._20_4_ * 0.0;
        auVar48._24_4_ = auVar108._24_4_ * 0.0;
        auVar48._28_4_ = auVar108._28_4_;
        auVar108 = vfmsub231ps_avx512vl(auVar48,auVar107,auVar105);
        auVar49._4_4_ = auVar99._4_4_ * auVar105._4_4_;
        auVar49._0_4_ = auVar99._0_4_ * auVar105._0_4_;
        auVar49._8_4_ = auVar99._8_4_ * auVar105._8_4_;
        auVar49._12_4_ = auVar99._12_4_ * auVar105._12_4_;
        auVar49._16_4_ = auVar105._16_4_ * 0.0;
        auVar49._20_4_ = auVar105._20_4_ * 0.0;
        auVar49._24_4_ = auVar105._24_4_ * 0.0;
        auVar49._28_4_ = auVar105._28_4_;
        auVar8 = vfmsub231ps_fma(auVar49,ZEXT1632(auVar98),auVar106);
        auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar8),auVar104,auVar108);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar104,ZEXT1632(auVar7));
        auVar102 = ZEXT1632(auVar100);
        uVar86 = vcmpps_avx512vl(auVar106,auVar102,2);
        bVar85 = (byte)uVar86;
        fVar161 = (float)((uint)(bVar85 & 1) * auVar96._0_4_ |
                         (uint)!(bool)(bVar85 & 1) * auVar9._0_4_);
        bVar17 = (bool)((byte)(uVar86 >> 1) & 1);
        fVar142 = (float)((uint)bVar17 * auVar96._4_4_ | (uint)!bVar17 * auVar9._4_4_);
        bVar17 = (bool)((byte)(uVar86 >> 2) & 1);
        fVar144 = (float)((uint)bVar17 * auVar96._8_4_ | (uint)!bVar17 * auVar9._8_4_);
        bVar17 = (bool)((byte)(uVar86 >> 3) & 1);
        fVar146 = (float)((uint)bVar17 * auVar96._12_4_ | (uint)!bVar17 * auVar9._12_4_);
        auVar115 = ZEXT1632(CONCAT412(fVar146,CONCAT48(fVar144,CONCAT44(fVar142,fVar161))));
        fVar173 = (float)((uint)(bVar85 & 1) * auVar97._0_4_ |
                         (uint)!(bool)(bVar85 & 1) * auVar10._0_4_);
        bVar17 = (bool)((byte)(uVar86 >> 1) & 1);
        fVar143 = (float)((uint)bVar17 * auVar97._4_4_ | (uint)!bVar17 * auVar10._4_4_);
        bVar17 = (bool)((byte)(uVar86 >> 2) & 1);
        fVar145 = (float)((uint)bVar17 * auVar97._8_4_ | (uint)!bVar17 * auVar10._8_4_);
        bVar17 = (bool)((byte)(uVar86 >> 3) & 1);
        fVar147 = (float)((uint)bVar17 * auVar97._12_4_ | (uint)!bVar17 * auVar10._12_4_);
        auVar109 = ZEXT1632(CONCAT412(fVar147,CONCAT48(fVar145,CONCAT44(fVar143,fVar173))));
        auVar122._0_4_ =
             (float)((uint)(bVar85 & 1) * auVar117._0_4_ |
                    (uint)!(bool)(bVar85 & 1) * auVar203._0_4_);
        bVar17 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar122._4_4_ = (float)((uint)bVar17 * auVar117._4_4_ | (uint)!bVar17 * auVar203._4_4_);
        bVar17 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar122._8_4_ = (float)((uint)bVar17 * auVar117._8_4_ | (uint)!bVar17 * auVar203._8_4_);
        bVar17 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar122._12_4_ = (float)((uint)bVar17 * auVar117._12_4_ | (uint)!bVar17 * auVar203._12_4_);
        fVar174 = (float)((uint)((byte)(uVar86 >> 4) & 1) * auVar117._16_4_);
        auVar122._16_4_ = fVar174;
        fVar179 = (float)((uint)((byte)(uVar86 >> 5) & 1) * auVar117._20_4_);
        auVar122._20_4_ = fVar179;
        fVar193 = (float)((uint)((byte)(uVar86 >> 6) & 1) * auVar117._24_4_);
        auVar122._24_4_ = fVar193;
        iVar1 = (uint)(byte)(uVar86 >> 7) * auVar117._28_4_;
        auVar122._28_4_ = iVar1;
        auVar105 = vblendmps_avx512vl(ZEXT1632(auVar98),auVar116);
        auVar123._0_4_ =
             (uint)(bVar85 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar7._0_4_;
        bVar17 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar123._4_4_ = (uint)bVar17 * auVar105._4_4_ | (uint)!bVar17 * auVar7._4_4_;
        bVar17 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar123._8_4_ = (uint)bVar17 * auVar105._8_4_ | (uint)!bVar17 * auVar7._8_4_;
        bVar17 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar123._12_4_ = (uint)bVar17 * auVar105._12_4_ | (uint)!bVar17 * auVar7._12_4_;
        auVar123._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * auVar105._16_4_;
        auVar123._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * auVar105._20_4_;
        auVar123._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * auVar105._24_4_;
        auVar123._28_4_ = (uint)(byte)(uVar86 >> 7) * auVar105._28_4_;
        auVar105 = vblendmps_avx512vl(ZEXT1632(auVar99),ZEXT1632(auVar101));
        auVar124._0_4_ =
             (float)((uint)(bVar85 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar97._0_4_
                    );
        bVar17 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar124._4_4_ = (float)((uint)bVar17 * auVar105._4_4_ | (uint)!bVar17 * auVar97._4_4_);
        bVar17 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar124._8_4_ = (float)((uint)bVar17 * auVar105._8_4_ | (uint)!bVar17 * auVar97._8_4_);
        bVar17 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar124._12_4_ = (float)((uint)bVar17 * auVar105._12_4_ | (uint)!bVar17 * auVar97._12_4_);
        fVar194 = (float)((uint)((byte)(uVar86 >> 4) & 1) * auVar105._16_4_);
        auVar124._16_4_ = fVar194;
        fVar195 = (float)((uint)((byte)(uVar86 >> 5) & 1) * auVar105._20_4_);
        auVar124._20_4_ = fVar195;
        fVar178 = (float)((uint)((byte)(uVar86 >> 6) & 1) * auVar105._24_4_);
        auVar124._24_4_ = fVar178;
        auVar124._28_4_ = (uint)(byte)(uVar86 >> 7) * auVar105._28_4_;
        auVar105 = vblendmps_avx512vl(auVar107,ZEXT1632(auVar222));
        auVar125._0_4_ =
             (float)((uint)(bVar85 & 1) * auVar105._0_4_ |
                    (uint)!(bool)(bVar85 & 1) * auVar117._0_4_);
        bVar17 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar125._4_4_ = (float)((uint)bVar17 * auVar105._4_4_ | (uint)!bVar17 * auVar117._4_4_);
        bVar17 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar125._8_4_ = (float)((uint)bVar17 * auVar105._8_4_ | (uint)!bVar17 * auVar117._8_4_);
        bVar17 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar125._12_4_ = (float)((uint)bVar17 * auVar105._12_4_ | (uint)!bVar17 * auVar117._12_4_);
        bVar17 = (bool)((byte)(uVar86 >> 4) & 1);
        auVar125._16_4_ = (float)((uint)bVar17 * auVar105._16_4_ | (uint)!bVar17 * auVar117._16_4_);
        bVar17 = (bool)((byte)(uVar86 >> 5) & 1);
        auVar125._20_4_ = (float)((uint)bVar17 * auVar105._20_4_ | (uint)!bVar17 * auVar117._20_4_);
        bVar17 = (bool)((byte)(uVar86 >> 6) & 1);
        auVar125._24_4_ = (float)((uint)bVar17 * auVar105._24_4_ | (uint)!bVar17 * auVar117._24_4_);
        bVar17 = SUB81(uVar86 >> 7,0);
        auVar125._28_4_ = (uint)bVar17 * auVar105._28_4_ | (uint)!bVar17 * auVar117._28_4_;
        auVar126._0_4_ =
             (uint)(bVar85 & 1) * (int)auVar98._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar116._0_4_;
        bVar17 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar126._4_4_ = (uint)bVar17 * (int)auVar98._4_4_ | (uint)!bVar17 * auVar116._4_4_;
        bVar17 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar126._8_4_ = (uint)bVar17 * (int)auVar98._8_4_ | (uint)!bVar17 * auVar116._8_4_;
        bVar17 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar126._12_4_ = (uint)bVar17 * (int)auVar98._12_4_ | (uint)!bVar17 * auVar116._12_4_;
        auVar126._16_4_ = (uint)!(bool)((byte)(uVar86 >> 4) & 1) * auVar116._16_4_;
        auVar126._20_4_ = (uint)!(bool)((byte)(uVar86 >> 5) & 1) * auVar116._20_4_;
        auVar126._24_4_ = (uint)!(bool)((byte)(uVar86 >> 6) & 1) * auVar116._24_4_;
        auVar126._28_4_ = (uint)!SUB81(uVar86 >> 7,0) * auVar116._28_4_;
        bVar17 = (bool)((byte)(uVar86 >> 1) & 1);
        bVar19 = (bool)((byte)(uVar86 >> 2) & 1);
        bVar20 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar127._0_4_ =
             (uint)(bVar85 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar222._0_4_;
        bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar127._4_4_ = (uint)bVar18 * auVar107._4_4_ | (uint)!bVar18 * auVar222._4_4_;
        bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar127._8_4_ = (uint)bVar18 * auVar107._8_4_ | (uint)!bVar18 * auVar222._8_4_;
        bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar127._12_4_ = (uint)bVar18 * auVar107._12_4_ | (uint)!bVar18 * auVar222._12_4_;
        auVar127._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * auVar107._16_4_;
        auVar127._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * auVar107._20_4_;
        auVar127._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * auVar107._24_4_;
        iVar2 = (uint)(byte)(uVar86 >> 7) * auVar107._28_4_;
        auVar127._28_4_ = iVar2;
        auVar110 = vsubps_avx512vl(auVar126,auVar115);
        auVar105 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar99._12_4_ |
                                                 (uint)!bVar20 * auVar101._12_4_,
                                                 CONCAT48((uint)bVar19 * (int)auVar99._8_4_ |
                                                          (uint)!bVar19 * auVar101._8_4_,
                                                          CONCAT44((uint)bVar17 * (int)auVar99._4_4_
                                                                   | (uint)!bVar17 * auVar101._4_4_,
                                                                   (uint)(bVar85 & 1) *
                                                                   (int)auVar99._0_4_ |
                                                                   (uint)!(bool)(bVar85 & 1) *
                                                                   auVar101._0_4_)))),auVar109);
        auVar117 = vsubps_avx(auVar127,auVar122);
        auVar116 = vsubps_avx(auVar115,auVar123);
        auVar107 = vsubps_avx(auVar109,auVar124);
        auVar108 = vsubps_avx(auVar122,auVar125);
        auVar50._4_4_ = auVar117._4_4_ * fVar142;
        auVar50._0_4_ = auVar117._0_4_ * fVar161;
        auVar50._8_4_ = auVar117._8_4_ * fVar144;
        auVar50._12_4_ = auVar117._12_4_ * fVar146;
        auVar50._16_4_ = auVar117._16_4_ * 0.0;
        auVar50._20_4_ = auVar117._20_4_ * 0.0;
        auVar50._24_4_ = auVar117._24_4_ * 0.0;
        auVar50._28_4_ = iVar2;
        auVar96 = vfmsub231ps_fma(auVar50,auVar122,auVar110);
        auVar51._4_4_ = fVar143 * auVar110._4_4_;
        auVar51._0_4_ = fVar173 * auVar110._0_4_;
        auVar51._8_4_ = fVar145 * auVar110._8_4_;
        auVar51._12_4_ = fVar147 * auVar110._12_4_;
        auVar51._16_4_ = auVar110._16_4_ * 0.0;
        auVar51._20_4_ = auVar110._20_4_ * 0.0;
        auVar51._24_4_ = auVar110._24_4_ * 0.0;
        auVar51._28_4_ = auVar106._28_4_;
        auVar97 = vfmsub231ps_fma(auVar51,auVar115,auVar105);
        auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar97),auVar102,ZEXT1632(auVar96));
        auVar189._0_4_ = auVar105._0_4_ * auVar122._0_4_;
        auVar189._4_4_ = auVar105._4_4_ * auVar122._4_4_;
        auVar189._8_4_ = auVar105._8_4_ * auVar122._8_4_;
        auVar189._12_4_ = auVar105._12_4_ * auVar122._12_4_;
        auVar189._16_4_ = auVar105._16_4_ * fVar174;
        auVar189._20_4_ = auVar105._20_4_ * fVar179;
        auVar189._24_4_ = auVar105._24_4_ * fVar193;
        auVar189._28_4_ = 0;
        auVar96 = vfmsub231ps_fma(auVar189,auVar109,auVar117);
        auVar111 = vfmadd231ps_avx512vl(auVar106,auVar102,ZEXT1632(auVar96));
        auVar106 = vmulps_avx512vl(auVar108,auVar123);
        auVar106 = vfmsub231ps_avx512vl(auVar106,auVar116,auVar125);
        auVar52._4_4_ = auVar107._4_4_ * auVar125._4_4_;
        auVar52._0_4_ = auVar107._0_4_ * auVar125._0_4_;
        auVar52._8_4_ = auVar107._8_4_ * auVar125._8_4_;
        auVar52._12_4_ = auVar107._12_4_ * auVar125._12_4_;
        auVar52._16_4_ = auVar107._16_4_ * auVar125._16_4_;
        auVar52._20_4_ = auVar107._20_4_ * auVar125._20_4_;
        auVar52._24_4_ = auVar107._24_4_ * auVar125._24_4_;
        auVar52._28_4_ = auVar125._28_4_;
        auVar96 = vfmsub231ps_fma(auVar52,auVar124,auVar108);
        auVar190._0_4_ = auVar124._0_4_ * auVar116._0_4_;
        auVar190._4_4_ = auVar124._4_4_ * auVar116._4_4_;
        auVar190._8_4_ = auVar124._8_4_ * auVar116._8_4_;
        auVar190._12_4_ = auVar124._12_4_ * auVar116._12_4_;
        auVar190._16_4_ = fVar194 * auVar116._16_4_;
        auVar190._20_4_ = fVar195 * auVar116._20_4_;
        auVar190._24_4_ = fVar178 * auVar116._24_4_;
        auVar190._28_4_ = 0;
        auVar97 = vfmsub231ps_fma(auVar190,auVar107,auVar123);
        auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar97),auVar102,auVar106);
        auVar104 = vfmadd231ps_avx512vl(auVar106,auVar102,ZEXT1632(auVar96));
        auVar106 = vmaxps_avx(auVar111,auVar104);
        uVar150 = vcmpps_avx512vl(auVar106,auVar102,2);
        bVar95 = bVar95 & (byte)uVar150;
        auVar219 = ZEXT3264(local_360);
        auVar220 = ZEXT3264(local_340);
        auVar221 = ZEXT3264(local_380);
        auVar217 = ZEXT3264(local_3a0);
        auVar212 = ZEXT1664(_local_540);
        if (bVar95 == 0) {
          bVar95 = 0;
        }
        else {
          auVar53._4_4_ = auVar108._4_4_ * auVar105._4_4_;
          auVar53._0_4_ = auVar108._0_4_ * auVar105._0_4_;
          auVar53._8_4_ = auVar108._8_4_ * auVar105._8_4_;
          auVar53._12_4_ = auVar108._12_4_ * auVar105._12_4_;
          auVar53._16_4_ = auVar108._16_4_ * auVar105._16_4_;
          auVar53._20_4_ = auVar108._20_4_ * auVar105._20_4_;
          auVar53._24_4_ = auVar108._24_4_ * auVar105._24_4_;
          auVar53._28_4_ = auVar106._28_4_;
          auVar101 = vfmsub231ps_fma(auVar53,auVar107,auVar117);
          auVar54._4_4_ = auVar117._4_4_ * auVar116._4_4_;
          auVar54._0_4_ = auVar117._0_4_ * auVar116._0_4_;
          auVar54._8_4_ = auVar117._8_4_ * auVar116._8_4_;
          auVar54._12_4_ = auVar117._12_4_ * auVar116._12_4_;
          auVar54._16_4_ = auVar117._16_4_ * auVar116._16_4_;
          auVar54._20_4_ = auVar117._20_4_ * auVar116._20_4_;
          auVar54._24_4_ = auVar117._24_4_ * auVar116._24_4_;
          auVar54._28_4_ = auVar117._28_4_;
          auVar97 = vfmsub231ps_fma(auVar54,auVar110,auVar108);
          auVar55._4_4_ = auVar107._4_4_ * auVar110._4_4_;
          auVar55._0_4_ = auVar107._0_4_ * auVar110._0_4_;
          auVar55._8_4_ = auVar107._8_4_ * auVar110._8_4_;
          auVar55._12_4_ = auVar107._12_4_ * auVar110._12_4_;
          auVar55._16_4_ = auVar107._16_4_ * auVar110._16_4_;
          auVar55._20_4_ = auVar107._20_4_ * auVar110._20_4_;
          auVar55._24_4_ = auVar107._24_4_ * auVar110._24_4_;
          auVar55._28_4_ = auVar107._28_4_;
          auVar222 = vfmsub231ps_fma(auVar55,auVar116,auVar105);
          auVar96 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar97),ZEXT1632(auVar222));
          auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar96),ZEXT1632(auVar101),auVar102);
          auVar105 = vrcp14ps_avx512vl(auVar106);
          auVar30._8_4_ = 0x3f800000;
          auVar30._0_8_ = &DAT_3f8000003f800000;
          auVar30._12_4_ = 0x3f800000;
          auVar30._16_4_ = 0x3f800000;
          auVar30._20_4_ = 0x3f800000;
          auVar30._24_4_ = 0x3f800000;
          auVar30._28_4_ = 0x3f800000;
          auVar117 = vfnmadd213ps_avx512vl(auVar105,auVar106,auVar30);
          auVar96 = vfmadd132ps_fma(auVar117,auVar105,auVar105);
          auVar56._4_4_ = auVar222._4_4_ * auVar122._4_4_;
          auVar56._0_4_ = auVar222._0_4_ * auVar122._0_4_;
          auVar56._8_4_ = auVar222._8_4_ * auVar122._8_4_;
          auVar56._12_4_ = auVar222._12_4_ * auVar122._12_4_;
          auVar56._16_4_ = fVar174 * 0.0;
          auVar56._20_4_ = fVar179 * 0.0;
          auVar56._24_4_ = fVar193 * 0.0;
          auVar56._28_4_ = iVar1;
          auVar97 = vfmadd231ps_fma(auVar56,auVar109,ZEXT1632(auVar97));
          auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar115,ZEXT1632(auVar101));
          fVar179 = auVar96._0_4_;
          fVar193 = auVar96._4_4_;
          fVar194 = auVar96._8_4_;
          fVar195 = auVar96._12_4_;
          auVar105 = ZEXT1632(CONCAT412(auVar97._12_4_ * fVar195,
                                        CONCAT48(auVar97._8_4_ * fVar194,
                                                 CONCAT44(auVar97._4_4_ * fVar193,
                                                          auVar97._0_4_ * fVar179))));
          auVar202._4_4_ = fVar175;
          auVar202._0_4_ = fVar175;
          auVar202._8_4_ = fVar175;
          auVar202._12_4_ = fVar175;
          auVar202._16_4_ = fVar175;
          auVar202._20_4_ = fVar175;
          auVar202._24_4_ = fVar175;
          auVar202._28_4_ = fVar175;
          uVar150 = vcmpps_avx512vl(auVar202,auVar105,2);
          fVar174 = (ray->super_RayK<1>).tfar;
          auVar31._4_4_ = fVar174;
          auVar31._0_4_ = fVar174;
          auVar31._8_4_ = fVar174;
          auVar31._12_4_ = fVar174;
          auVar31._16_4_ = fVar174;
          auVar31._20_4_ = fVar174;
          auVar31._24_4_ = fVar174;
          auVar31._28_4_ = fVar174;
          uVar24 = vcmpps_avx512vl(auVar105,auVar31,2);
          bVar95 = (byte)uVar150 & (byte)uVar24 & bVar95;
          if (bVar95 != 0) {
            uVar150 = vcmpps_avx512vl(auVar106,auVar102,4);
            if ((bVar95 & (byte)uVar150) != 0) {
              bVar95 = bVar95 & (byte)uVar150;
              fVar174 = auVar111._0_4_ * fVar179;
              fVar178 = auVar111._4_4_ * fVar193;
              auVar57._4_4_ = fVar178;
              auVar57._0_4_ = fVar174;
              fVar161 = auVar111._8_4_ * fVar194;
              auVar57._8_4_ = fVar161;
              fVar173 = auVar111._12_4_ * fVar195;
              auVar57._12_4_ = fVar173;
              fVar142 = auVar111._16_4_ * 0.0;
              auVar57._16_4_ = fVar142;
              fVar143 = auVar111._20_4_ * 0.0;
              auVar57._20_4_ = fVar143;
              fVar144 = auVar111._24_4_ * 0.0;
              auVar57._24_4_ = fVar144;
              auVar57._28_4_ = auVar111._28_4_;
              fVar179 = auVar104._0_4_ * fVar179;
              fVar193 = auVar104._4_4_ * fVar193;
              auVar58._4_4_ = fVar193;
              auVar58._0_4_ = fVar179;
              fVar194 = auVar104._8_4_ * fVar194;
              auVar58._8_4_ = fVar194;
              fVar195 = auVar104._12_4_ * fVar195;
              auVar58._12_4_ = fVar195;
              fVar145 = auVar104._16_4_ * 0.0;
              auVar58._16_4_ = fVar145;
              fVar146 = auVar104._20_4_ * 0.0;
              auVar58._20_4_ = fVar146;
              fVar147 = auVar104._24_4_ * 0.0;
              auVar58._24_4_ = fVar147;
              auVar58._28_4_ = auVar104._28_4_;
              auVar198._8_4_ = 0x3f800000;
              auVar198._0_8_ = &DAT_3f8000003f800000;
              auVar198._12_4_ = 0x3f800000;
              auVar198._16_4_ = 0x3f800000;
              auVar198._20_4_ = 0x3f800000;
              auVar198._24_4_ = 0x3f800000;
              auVar198._28_4_ = 0x3f800000;
              auVar106 = vsubps_avx(auVar198,auVar57);
              local_3c0._0_4_ =
                   (uint)(bVar85 & 1) * (int)fVar174 | (uint)!(bool)(bVar85 & 1) * auVar106._0_4_;
              bVar17 = (bool)((byte)(uVar86 >> 1) & 1);
              local_3c0._4_4_ = (uint)bVar17 * (int)fVar178 | (uint)!bVar17 * auVar106._4_4_;
              bVar17 = (bool)((byte)(uVar86 >> 2) & 1);
              local_3c0._8_4_ = (uint)bVar17 * (int)fVar161 | (uint)!bVar17 * auVar106._8_4_;
              bVar17 = (bool)((byte)(uVar86 >> 3) & 1);
              local_3c0._12_4_ = (uint)bVar17 * (int)fVar173 | (uint)!bVar17 * auVar106._12_4_;
              bVar17 = (bool)((byte)(uVar86 >> 4) & 1);
              local_3c0._16_4_ = (uint)bVar17 * (int)fVar142 | (uint)!bVar17 * auVar106._16_4_;
              bVar17 = (bool)((byte)(uVar86 >> 5) & 1);
              local_3c0._20_4_ = (uint)bVar17 * (int)fVar143 | (uint)!bVar17 * auVar106._20_4_;
              bVar17 = (bool)((byte)(uVar86 >> 6) & 1);
              local_3c0._24_4_ = (uint)bVar17 * (int)fVar144 | (uint)!bVar17 * auVar106._24_4_;
              bVar17 = SUB81(uVar86 >> 7,0);
              local_3c0._28_4_ = (uint)bVar17 * auVar111._28_4_ | (uint)!bVar17 * auVar106._28_4_;
              auVar106 = vsubps_avx(auVar198,auVar58);
              bVar17 = (bool)((byte)(uVar86 >> 1) & 1);
              bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
              bVar19 = (bool)((byte)(uVar86 >> 3) & 1);
              bVar20 = (bool)((byte)(uVar86 >> 4) & 1);
              bVar21 = (bool)((byte)(uVar86 >> 5) & 1);
              bVar22 = (bool)((byte)(uVar86 >> 6) & 1);
              bVar23 = SUB81(uVar86 >> 7,0);
              local_1a0._4_4_ = (uint)bVar17 * (int)fVar193 | (uint)!bVar17 * auVar106._4_4_;
              local_1a0._0_4_ =
                   (uint)(bVar85 & 1) * (int)fVar179 | (uint)!(bool)(bVar85 & 1) * auVar106._0_4_;
              local_1a0._8_4_ = (uint)bVar18 * (int)fVar194 | (uint)!bVar18 * auVar106._8_4_;
              local_1a0._12_4_ = (uint)bVar19 * (int)fVar195 | (uint)!bVar19 * auVar106._12_4_;
              local_1a0._16_4_ = (uint)bVar20 * (int)fVar145 | (uint)!bVar20 * auVar106._16_4_;
              local_1a0._20_4_ = (uint)bVar21 * (int)fVar146 | (uint)!bVar21 * auVar106._20_4_;
              local_1a0._24_4_ = (uint)bVar22 * (int)fVar147 | (uint)!bVar22 * auVar106._24_4_;
              local_1a0._28_4_ = (uint)bVar23 * auVar104._28_4_ | (uint)!bVar23 * auVar106._28_4_;
              local_460 = auVar105;
              goto LAB_01ea79b0;
            }
          }
          bVar95 = 0;
        }
LAB_01ea79b0:
        auVar226 = ZEXT3264(local_4c0);
        auVar225 = ZEXT3264(local_4a0);
        auVar224 = ZEXT3264(local_480);
        auVar218 = ZEXT3264(auVar112);
        local_5b0 = auVar151;
        _local_530 = auVar159;
        if (bVar95 != 0) {
          auVar106 = vsubps_avx(ZEXT1632(auVar11),auVar103);
          auVar96 = vfmadd213ps_fma(auVar106,local_3c0,auVar103);
          fVar174 = local_5e8->depth_scale;
          auVar32._4_4_ = fVar174;
          auVar32._0_4_ = fVar174;
          auVar32._8_4_ = fVar174;
          auVar32._12_4_ = fVar174;
          auVar32._16_4_ = fVar174;
          auVar32._20_4_ = fVar174;
          auVar32._24_4_ = fVar174;
          auVar32._28_4_ = fVar174;
          auVar106 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar96._12_4_ + auVar96._12_4_,
                                                        CONCAT48(auVar96._8_4_ + auVar96._8_4_,
                                                                 CONCAT44(auVar96._4_4_ +
                                                                          auVar96._4_4_,
                                                                          auVar96._0_4_ +
                                                                          auVar96._0_4_)))),auVar32)
          ;
          uVar150 = vcmpps_avx512vl(local_460,auVar106,6);
          bVar95 = bVar95 & (byte)uVar150;
          if (bVar95 != 0) {
            auVar153._8_4_ = 0xbf800000;
            auVar153._0_8_ = 0xbf800000bf800000;
            auVar153._12_4_ = 0xbf800000;
            auVar153._16_4_ = 0xbf800000;
            auVar153._20_4_ = 0xbf800000;
            auVar153._24_4_ = 0xbf800000;
            auVar153._28_4_ = 0xbf800000;
            auVar33._8_4_ = 0x40000000;
            auVar33._0_8_ = 0x4000000040000000;
            auVar33._12_4_ = 0x40000000;
            auVar33._16_4_ = 0x40000000;
            auVar33._20_4_ = 0x40000000;
            auVar33._24_4_ = 0x40000000;
            auVar33._28_4_ = 0x40000000;
            local_1a0 = vfmadd132ps_avx512vl(local_1a0,auVar153,auVar33);
            local_2e0 = local_3c0;
            auVar106 = local_1a0;
            local_2c0 = local_1a0;
            local_2a0 = local_460;
            local_280 = 0;
            local_27c = iVar13;
            local_270 = local_5b0._0_8_;
            uStack_268 = local_5b0._8_8_;
            local_260 = local_510._0_8_;
            uStack_258 = local_510._8_8_;
            local_250 = local_520._0_8_;
            uStack_248 = local_520._8_8_;
            local_240 = local_530;
            uStack_238 = uStack_528;
            local_230 = bVar95;
            local_1a0 = auVar106;
            if ((pGVar91->mask & (ray->super_RayK<1>).mask) != 0) {
              fVar174 = 1.0 / auVar205._0_4_;
              local_220[0] = fVar174 * (local_3c0._0_4_ + 0.0);
              local_220[1] = fVar174 * (local_3c0._4_4_ + 1.0);
              local_220[2] = fVar174 * (local_3c0._8_4_ + 2.0);
              local_220[3] = fVar174 * (local_3c0._12_4_ + 3.0);
              fStack_210 = fVar174 * (local_3c0._16_4_ + 4.0);
              fStack_20c = fVar174 * (local_3c0._20_4_ + 5.0);
              fStack_208 = fVar174 * (local_3c0._24_4_ + 6.0);
              fStack_204 = local_3c0._28_4_ + 7.0;
              local_200 = local_1a0._0_8_;
              uStack_1f8 = local_1a0._8_8_;
              uStack_1f0 = local_1a0._16_8_;
              uStack_1e8 = local_1a0._24_8_;
              local_1e0 = local_460;
              auVar154._8_4_ = 0x7f800000;
              auVar154._0_8_ = 0x7f8000007f800000;
              auVar154._12_4_ = 0x7f800000;
              auVar154._16_4_ = 0x7f800000;
              auVar154._20_4_ = 0x7f800000;
              auVar154._24_4_ = 0x7f800000;
              auVar154._28_4_ = 0x7f800000;
              auVar105 = vblendmps_avx512vl(auVar154,local_460);
              auVar128._0_4_ =
                   (uint)(bVar95 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar95 & 1) * 0x7f800000;
              bVar17 = (bool)(bVar95 >> 1 & 1);
              auVar128._4_4_ = (uint)bVar17 * auVar105._4_4_ | (uint)!bVar17 * 0x7f800000;
              bVar17 = (bool)(bVar95 >> 2 & 1);
              auVar128._8_4_ = (uint)bVar17 * auVar105._8_4_ | (uint)!bVar17 * 0x7f800000;
              bVar17 = (bool)(bVar95 >> 3 & 1);
              auVar128._12_4_ = (uint)bVar17 * auVar105._12_4_ | (uint)!bVar17 * 0x7f800000;
              bVar17 = (bool)(bVar95 >> 4 & 1);
              auVar128._16_4_ = (uint)bVar17 * auVar105._16_4_ | (uint)!bVar17 * 0x7f800000;
              bVar17 = (bool)(bVar95 >> 5 & 1);
              auVar128._20_4_ = (uint)bVar17 * auVar105._20_4_ | (uint)!bVar17 * 0x7f800000;
              bVar17 = (bool)(bVar95 >> 6 & 1);
              auVar128._24_4_ = (uint)bVar17 * auVar105._24_4_ | (uint)!bVar17 * 0x7f800000;
              auVar128._28_4_ =
                   (uint)(bVar95 >> 7) * auVar105._28_4_ | (uint)!(bool)(bVar95 >> 7) * 0x7f800000;
              auVar105 = vshufps_avx(auVar128,auVar128,0xb1);
              auVar105 = vminps_avx(auVar128,auVar105);
              auVar117 = vshufpd_avx(auVar105,auVar105,5);
              auVar105 = vminps_avx(auVar105,auVar117);
              auVar117 = vpermpd_avx2(auVar105,0x4e);
              auVar105 = vminps_avx(auVar105,auVar117);
              uVar150 = vcmpps_avx512vl(auVar128,auVar105,0);
              bVar84 = (byte)uVar150 & bVar95;
              bVar85 = bVar95;
              if (bVar84 != 0) {
                bVar85 = bVar84;
              }
              uVar88 = 0;
              for (uVar87 = (uint)bVar85; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000) {
                uVar88 = uVar88 + 1;
              }
              uVar86 = (ulong)uVar88;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar91->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar174 = local_220[uVar86];
                fVar179 = *(float *)((long)&local_200 + uVar86 * 4);
                fVar193 = 1.0 - fVar174;
                auVar26._8_4_ = 0x80000000;
                auVar26._0_8_ = 0x8000000080000000;
                auVar26._12_4_ = 0x80000000;
                auVar101 = vxorps_avx512vl(ZEXT416((uint)fVar193),auVar26);
                auVar96 = ZEXT416((uint)(fVar174 * fVar193 * 4.0));
                auVar97 = vfnmsub213ss_fma(ZEXT416((uint)fVar174),ZEXT416((uint)fVar174),auVar96);
                auVar96 = vfmadd213ss_fma(ZEXT416((uint)fVar193),ZEXT416((uint)fVar193),auVar96);
                fVar193 = fVar193 * auVar101._0_4_ * 0.5;
                fVar194 = auVar97._0_4_ * 0.5;
                fVar195 = auVar96._0_4_ * 0.5;
                fVar178 = fVar174 * fVar174 * 0.5;
                auVar181._0_4_ = fVar178 * (float)local_530._0_4_;
                auVar181._4_4_ = fVar178 * (float)local_530._4_4_;
                auVar181._8_4_ = fVar178 * (float)uStack_528;
                auVar181._12_4_ = fVar178 * uStack_528._4_4_;
                auVar163._4_4_ = fVar195;
                auVar163._0_4_ = fVar195;
                auVar163._8_4_ = fVar195;
                auVar163._12_4_ = fVar195;
                auVar96 = vfmadd132ps_fma(auVar163,auVar181,local_520);
                auVar182._4_4_ = fVar194;
                auVar182._0_4_ = fVar194;
                auVar182._8_4_ = fVar194;
                auVar182._12_4_ = fVar194;
                auVar96 = vfmadd132ps_fma(auVar182,auVar96,local_510);
                auVar164._4_4_ = fVar193;
                auVar164._0_4_ = fVar193;
                auVar164._8_4_ = fVar193;
                auVar164._12_4_ = fVar193;
                (ray->super_RayK<1>).tfar = *(float *)(local_1e0 + uVar86 * 4);
                auVar96 = vfmadd132ps_fma(auVar164,auVar96,local_5b0);
                uVar150 = vmovlps_avx(auVar96);
                *(undefined8 *)&(ray->Ng).field_0 = uVar150;
                fVar193 = (float)vextractps_avx(auVar96,2);
                (ray->Ng).field_0.field_0.z = fVar193;
                ray->u = fVar174;
                ray->v = fVar179;
                ray->primID = uVar89;
                ray->geomID = uVar94;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
              }
              else {
                local_420 = local_510._0_4_;
                uStack_41c = local_510._4_4_;
                uStack_418 = local_510._8_8_;
                local_430 = local_520._0_8_;
                uStack_428 = local_520._8_8_;
                local_520 = auVar160;
                local_510 = auVar162;
                local_440 = (float)local_530._0_4_;
                fStack_43c = (float)local_530._4_4_;
                fStack_438 = (float)uStack_528;
                fStack_434 = uStack_528._4_4_;
                do {
                  _local_530 = auVar159;
                  auVar222 = auVar223._0_16_;
                  local_594 = local_220[uVar86];
                  local_590 = *(undefined4 *)((long)&local_200 + uVar86 * 4);
                  fVar180 = (ray->super_RayK<1>).tfar;
                  (ray->super_RayK<1>).tfar = *(float *)(local_1e0 + uVar86 * 4);
                  local_5e0.context = context->user;
                  fVar174 = 1.0 - local_594;
                  auVar29._8_4_ = 0x80000000;
                  auVar29._0_8_ = 0x8000000080000000;
                  auVar29._12_4_ = 0x80000000;
                  auVar101 = vxorps_avx512vl(ZEXT416((uint)fVar174),auVar29);
                  auVar96 = ZEXT416((uint)(local_594 * fVar174 * 4.0));
                  auVar97 = vfnmsub213ss_fma(ZEXT416((uint)local_594),ZEXT416((uint)local_594),
                                             auVar96);
                  auVar96 = vfmadd213ss_fma(ZEXT416((uint)fVar174),ZEXT416((uint)fVar174),auVar96);
                  fVar174 = fVar174 * auVar101._0_4_ * 0.5;
                  fVar179 = auVar97._0_4_ * 0.5;
                  fVar193 = auVar96._0_4_ * 0.5;
                  fVar194 = local_594 * local_594 * 0.5;
                  auVar187._0_4_ = fVar194 * local_440;
                  auVar187._4_4_ = fVar194 * fStack_43c;
                  auVar187._8_4_ = fVar194 * fStack_438;
                  auVar187._12_4_ = fVar194 * fStack_434;
                  auVar169._4_4_ = fVar193;
                  auVar169._0_4_ = fVar193;
                  auVar169._8_4_ = fVar193;
                  auVar169._12_4_ = fVar193;
                  auVar80._8_8_ = uStack_428;
                  auVar80._0_8_ = local_430;
                  auVar96 = vfmadd132ps_fma(auVar169,auVar187,auVar80);
                  auVar188._4_4_ = fVar179;
                  auVar188._0_4_ = fVar179;
                  auVar188._8_4_ = fVar179;
                  auVar188._12_4_ = fVar179;
                  auVar81._4_4_ = uStack_41c;
                  auVar81._0_4_ = local_420;
                  auVar81._8_8_ = uStack_418;
                  auVar96 = vfmadd132ps_fma(auVar188,auVar96,auVar81);
                  auVar170._4_4_ = fVar174;
                  auVar170._0_4_ = fVar174;
                  auVar170._8_4_ = fVar174;
                  auVar170._12_4_ = fVar174;
                  auVar96 = vfmadd132ps_fma(auVar170,auVar96,local_5b0);
                  local_5a0 = vmovlps_avx(auVar96);
                  local_598 = vextractps_avx(auVar96,2);
                  local_58c = (int)local_5f0;
                  local_588 = (int)local_5f8;
                  local_584 = (local_5e0.context)->instID[0];
                  local_580 = (local_5e0.context)->instPrimID[0];
                  local_5fc = -1;
                  local_5e0.valid = &local_5fc;
                  local_5e0.geometryUserPtr = pGVar91->userPtr;
                  local_5e0.ray = (RTCRayN *)ray;
                  local_5e0.hit = (RTCHitN *)&local_5a0;
                  local_5e0.N = 1;
                  local_320 = (undefined4)uVar86;
                  uStack_31c = (undefined4)(uVar86 >> 0x20);
                  if (pGVar91->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01ea8ce3:
                    auVar96 = auVar223._0_16_;
                    p_Var16 = context->args->filter;
                    if (p_Var16 != (RTCFilterFunctionN)0x0) {
                      if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar91->field_8).field_0x2 & 0x40) != 0)) {
                        (*p_Var16)(&local_5e0);
                        uVar86 = CONCAT44(uStack_31c,local_320);
                        auVar212 = ZEXT1664(_local_540);
                        auVar218 = ZEXT3264(local_3e0);
                        auVar226 = ZEXT3264(local_4c0);
                        auVar225 = ZEXT3264(local_4a0);
                        auVar224 = ZEXT3264(local_480);
                        auVar227 = ZEXT3264(local_560);
                        auVar217 = ZEXT3264(local_3a0);
                        auVar221 = ZEXT3264(local_380);
                        auVar220 = ZEXT3264(local_340);
                        auVar219 = ZEXT3264(local_360);
                        auVar96 = vxorps_avx512vl(auVar96,auVar96);
                        auVar223 = ZEXT1664(auVar96);
                        fVar175 = local_400;
                      }
                      if (*local_5e0.valid == 0) goto LAB_01ea8def;
                    }
                    (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).components[0] =
                         *(float *)local_5e0.hit;
                    (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_5e0.hit + 4);
                    (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_5e0.hit + 8);
                    *(float *)((long)local_5e0.ray + 0x3c) = *(float *)(local_5e0.hit + 0xc);
                    *(float *)((long)local_5e0.ray + 0x40) = *(float *)(local_5e0.hit + 0x10);
                    *(float *)((long)local_5e0.ray + 0x44) = *(float *)(local_5e0.hit + 0x14);
                    *(float *)((long)local_5e0.ray + 0x48) = *(float *)(local_5e0.hit + 0x18);
                    *(float *)((long)local_5e0.ray + 0x4c) = *(float *)(local_5e0.hit + 0x1c);
                    *(float *)((long)local_5e0.ray + 0x50) = *(float *)(local_5e0.hit + 0x20);
                  }
                  else {
                    (*pGVar91->intersectionFilterN)(&local_5e0);
                    uVar86 = CONCAT44(uStack_31c,local_320);
                    auVar212 = ZEXT1664(_local_540);
                    auVar218 = ZEXT3264(local_3e0);
                    auVar226 = ZEXT3264(local_4c0);
                    auVar225 = ZEXT3264(local_4a0);
                    auVar224 = ZEXT3264(local_480);
                    auVar227 = ZEXT3264(local_560);
                    auVar217 = ZEXT3264(local_3a0);
                    auVar221 = ZEXT3264(local_380);
                    auVar220 = ZEXT3264(local_340);
                    auVar219 = ZEXT3264(local_360);
                    auVar96 = vxorps_avx512vl(auVar222,auVar222);
                    auVar223 = ZEXT1664(auVar96);
                    fVar175 = local_400;
                    if (*local_5e0.valid != 0) goto LAB_01ea8ce3;
LAB_01ea8def:
                    (ray->super_RayK<1>).tfar = fVar180;
                  }
                  fVar180 = auVar212._0_4_;
                  auVar112 = auVar218._0_32_;
                  bVar85 = ~(byte)(1 << ((uint)uVar86 & 0x1f)) & bVar95;
                  fVar174 = (ray->super_RayK<1>).tfar;
                  auVar40._4_4_ = fVar174;
                  auVar40._0_4_ = fVar174;
                  auVar40._8_4_ = fVar174;
                  auVar40._12_4_ = fVar174;
                  auVar40._16_4_ = fVar174;
                  auVar40._20_4_ = fVar174;
                  auVar40._24_4_ = fVar174;
                  auVar40._28_4_ = fVar174;
                  uVar150 = vcmpps_avx512vl(local_460,auVar40,2);
                  bVar95 = bVar85 & (byte)uVar150;
                  if ((bVar85 & (byte)uVar150) != 0) {
                    auVar158._8_4_ = 0x7f800000;
                    auVar158._0_8_ = 0x7f8000007f800000;
                    auVar158._12_4_ = 0x7f800000;
                    auVar158._16_4_ = 0x7f800000;
                    auVar158._20_4_ = 0x7f800000;
                    auVar158._24_4_ = 0x7f800000;
                    auVar158._28_4_ = 0x7f800000;
                    auVar106 = vblendmps_avx512vl(auVar158,local_460);
                    auVar141._0_4_ =
                         (uint)(bVar95 & 1) * auVar106._0_4_ |
                         (uint)!(bool)(bVar95 & 1) * 0x7f800000;
                    bVar17 = (bool)(bVar95 >> 1 & 1);
                    auVar141._4_4_ = (uint)bVar17 * auVar106._4_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)(bVar95 >> 2 & 1);
                    auVar141._8_4_ = (uint)bVar17 * auVar106._8_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)(bVar95 >> 3 & 1);
                    auVar141._12_4_ = (uint)bVar17 * auVar106._12_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)(bVar95 >> 4 & 1);
                    auVar141._16_4_ = (uint)bVar17 * auVar106._16_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)(bVar95 >> 5 & 1);
                    auVar141._20_4_ = (uint)bVar17 * auVar106._20_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)(bVar95 >> 6 & 1);
                    auVar141._24_4_ = (uint)bVar17 * auVar106._24_4_ | (uint)!bVar17 * 0x7f800000;
                    auVar141._28_4_ =
                         (uint)(bVar95 >> 7) * auVar106._28_4_ |
                         (uint)!(bool)(bVar95 >> 7) * 0x7f800000;
                    auVar106 = vshufps_avx(auVar141,auVar141,0xb1);
                    auVar106 = vminps_avx(auVar141,auVar106);
                    auVar105 = vshufpd_avx(auVar106,auVar106,5);
                    auVar106 = vminps_avx(auVar106,auVar105);
                    auVar105 = vpermpd_avx2(auVar106,0x4e);
                    auVar106 = vminps_avx(auVar106,auVar105);
                    uVar150 = vcmpps_avx512vl(auVar141,auVar106,0);
                    bVar84 = (byte)uVar150 & bVar95;
                    bVar85 = bVar95;
                    if (bVar84 != 0) {
                      bVar85 = bVar84;
                    }
                    uVar94 = 0;
                    for (uVar89 = (uint)bVar85; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x80000000
                        ) {
                      uVar94 = uVar94 + 1;
                    }
                    uVar86 = (ulong)uVar94;
                  }
                  auVar159 = _local_530;
                  auVar160 = local_520;
                  auVar162 = local_510;
                } while (bVar95 != 0);
              }
            }
          }
        }
      }
      local_510 = auVar162;
      local_520 = auVar160;
      if (8 < iVar13) {
        auVar106 = vpbroadcastd_avx512vl();
        auVar212 = ZEXT3264(auVar106);
        local_400 = fVar180;
        fStack_3fc = fVar180;
        fStack_3f8 = fVar180;
        fStack_3f4 = fVar180;
        fStack_3f0 = fVar180;
        fStack_3ec = fVar180;
        fStack_3e8 = fVar180;
        fStack_3e4 = fVar180;
        local_320 = fVar175;
        uStack_31c = fVar175;
        uStack_318 = fVar175;
        uStack_314 = fVar175;
        uStack_310 = fVar175;
        uStack_30c = fVar175;
        uStack_308 = fVar175;
        uStack_304 = fVar175;
        local_300._4_4_ = 1.0 / (float)local_300._0_4_;
        local_300._0_4_ = local_300._4_4_;
        fStack_2f8 = (float)local_300._4_4_;
        fStack_2f4 = (float)local_300._4_4_;
        fStack_2f0 = (float)local_300._4_4_;
        fStack_2ec = (float)local_300._4_4_;
        fStack_2e8 = (float)local_300._4_4_;
        fStack_2e4 = (float)local_300._4_4_;
        lVar93 = 8;
        local_3e0 = auVar112;
        do {
          auVar106 = vpbroadcastd_avx512vl();
          auVar107 = vpor_avx2(auVar106,_DAT_0205a920);
          uVar24 = vpcmpgtd_avx512vl(auVar212._0_32_,auVar107);
          auVar106 = *(undefined1 (*) [32])(bspline_basis0 + lVar93 * 4 + lVar25);
          auVar105 = *(undefined1 (*) [32])(lVar25 + 0x222bfac + lVar93 * 4);
          auVar117 = *(undefined1 (*) [32])(lVar25 + 0x222c430 + lVar93 * 4);
          auVar116 = *(undefined1 (*) [32])(lVar25 + 0x222c8b4 + lVar93 * 4);
          local_4a0 = auVar225._0_32_;
          auVar108 = vmulps_avx512vl(local_4a0,auVar116);
          local_4c0 = auVar226._0_32_;
          auVar115 = vmulps_avx512vl(local_4c0,auVar116);
          auVar59._4_4_ = auVar116._4_4_ * (float)local_100._4_4_;
          auVar59._0_4_ = auVar116._0_4_ * (float)local_100._0_4_;
          auVar59._8_4_ = auVar116._8_4_ * fStack_f8;
          auVar59._12_4_ = auVar116._12_4_ * fStack_f4;
          auVar59._16_4_ = auVar116._16_4_ * fStack_f0;
          auVar59._20_4_ = auVar116._20_4_ * fStack_ec;
          auVar59._24_4_ = auVar116._24_4_ * fStack_e8;
          auVar59._28_4_ = auVar107._28_4_;
          auVar197 = auVar227._0_32_;
          auVar107 = vfmadd231ps_avx512vl(auVar108,auVar117,auVar197);
          local_480 = auVar224._0_32_;
          auVar108 = vfmadd231ps_avx512vl(auVar115,auVar117,local_480);
          auVar115 = vfmadd231ps_avx512vl(auVar59,auVar117,local_e0);
          auVar196 = auVar221._0_32_;
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar105,auVar196);
          auVar171 = auVar217._0_32_;
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar105,auVar171);
          auVar96 = vfmadd231ps_fma(auVar115,auVar105,local_c0);
          auVar172 = auVar219._0_32_;
          auVar111 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar172);
          local_340 = auVar220._0_32_;
          auVar104 = vfmadd231ps_avx512vl(auVar108,auVar106,local_340);
          auVar107 = *(undefined1 (*) [32])(bspline_basis1 + lVar93 * 4 + lVar25);
          auVar108 = *(undefined1 (*) [32])(lVar25 + 0x222e3cc + lVar93 * 4);
          auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar106,local_a0);
          auVar115 = *(undefined1 (*) [32])(lVar25 + 0x222e850 + lVar93 * 4);
          auVar109 = *(undefined1 (*) [32])(lVar25 + 0x222ecd4 + lVar93 * 4);
          auVar112 = vmulps_avx512vl(local_4a0,auVar109);
          auVar110 = vmulps_avx512vl(local_4c0,auVar109);
          auVar60._4_4_ = auVar109._4_4_ * (float)local_100._4_4_;
          auVar60._0_4_ = auVar109._0_4_ * (float)local_100._0_4_;
          auVar60._8_4_ = auVar109._8_4_ * fStack_f8;
          auVar60._12_4_ = auVar109._12_4_ * fStack_f4;
          auVar60._16_4_ = auVar109._16_4_ * fStack_f0;
          auVar60._20_4_ = auVar109._20_4_ * fStack_ec;
          auVar60._24_4_ = auVar109._24_4_ * fStack_e8;
          auVar60._28_4_ = uStack_e4;
          auVar112 = vfmadd231ps_avx512vl(auVar112,auVar115,auVar197);
          auVar110 = vfmadd231ps_avx512vl(auVar110,auVar115,local_480);
          auVar102 = vfmadd231ps_avx512vl(auVar60,auVar115,local_e0);
          auVar112 = vfmadd231ps_avx512vl(auVar112,auVar108,auVar196);
          auVar110 = vfmadd231ps_avx512vl(auVar110,auVar108,auVar171);
          auVar97 = vfmadd231ps_fma(auVar102,auVar108,local_c0);
          auVar102 = vfmadd231ps_avx512vl(auVar112,auVar107,auVar172);
          auVar103 = vfmadd231ps_avx512vl(auVar110,auVar107,local_340);
          auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar107,local_a0);
          auVar113 = vmaxps_avx512vl(ZEXT1632(auVar96),ZEXT1632(auVar97));
          auVar112 = vsubps_avx(auVar102,auVar111);
          auVar110 = vsubps_avx(auVar103,auVar104);
          auVar114 = vmulps_avx512vl(auVar104,auVar112);
          auVar129 = vmulps_avx512vl(auVar111,auVar110);
          auVar114 = vsubps_avx512vl(auVar114,auVar129);
          auVar129 = vmulps_avx512vl(auVar110,auVar110);
          auVar129 = vfmadd231ps_avx512vl(auVar129,auVar112,auVar112);
          auVar113 = vmulps_avx512vl(auVar113,auVar113);
          auVar113 = vmulps_avx512vl(auVar113,auVar129);
          auVar114 = vmulps_avx512vl(auVar114,auVar114);
          uVar150 = vcmpps_avx512vl(auVar114,auVar113,2);
          local_230 = (byte)uVar24 & (byte)uVar150;
          if (local_230 == 0) {
            auVar218 = ZEXT3264(auVar171);
            auVar227 = ZEXT3264(auVar197);
          }
          else {
            auVar109 = vmulps_avx512vl(local_3e0,auVar109);
            auVar115 = vfmadd213ps_avx512vl(auVar115,local_160,auVar109);
            auVar108 = vfmadd213ps_avx512vl(auVar108,local_140,auVar115);
            auVar107 = vfmadd213ps_avx512vl(auVar107,local_120,auVar108);
            auVar116 = vmulps_avx512vl(local_3e0,auVar116);
            auVar117 = vfmadd213ps_avx512vl(auVar117,local_160,auVar116);
            auVar105 = vfmadd213ps_avx512vl(auVar105,local_140,auVar117);
            auVar108 = vfmadd213ps_avx512vl(auVar106,local_120,auVar105);
            auVar106 = *(undefined1 (*) [32])(lVar25 + 0x222cd38 + lVar93 * 4);
            auVar105 = *(undefined1 (*) [32])(lVar25 + 0x222d1bc + lVar93 * 4);
            auVar117 = *(undefined1 (*) [32])(lVar25 + 0x222d640 + lVar93 * 4);
            auVar116 = *(undefined1 (*) [32])(lVar25 + 0x222dac4 + lVar93 * 4);
            auVar115 = vmulps_avx512vl(local_4a0,auVar116);
            auVar109 = vmulps_avx512vl(local_4c0,auVar116);
            auVar116 = vmulps_avx512vl(local_3e0,auVar116);
            auVar115 = vfmadd231ps_avx512vl(auVar115,auVar117,auVar197);
            auVar109 = vfmadd231ps_avx512vl(auVar109,auVar117,local_480);
            auVar117 = vfmadd231ps_avx512vl(auVar116,local_160,auVar117);
            auVar116 = vfmadd231ps_avx512vl(auVar115,auVar105,auVar196);
            auVar115 = vfmadd231ps_avx512vl(auVar109,auVar105,auVar171);
            auVar105 = vfmadd231ps_avx512vl(auVar117,local_140,auVar105);
            auVar116 = vfmadd231ps_avx512vl(auVar116,auVar106,auVar172);
            auVar115 = vfmadd231ps_avx512vl(auVar115,auVar106,local_340);
            auVar109 = vfmadd231ps_avx512vl(auVar105,local_120,auVar106);
            auVar106 = *(undefined1 (*) [32])(lVar25 + 0x222f158 + lVar93 * 4);
            auVar105 = *(undefined1 (*) [32])(lVar25 + 0x222fa60 + lVar93 * 4);
            auVar117 = *(undefined1 (*) [32])(lVar25 + 0x222fee4 + lVar93 * 4);
            auVar113 = vmulps_avx512vl(local_4a0,auVar117);
            auVar114 = vmulps_avx512vl(local_4c0,auVar117);
            auVar117 = vmulps_avx512vl(local_3e0,auVar117);
            auVar113 = vfmadd231ps_avx512vl(auVar113,auVar105,auVar197);
            auVar114 = vfmadd231ps_avx512vl(auVar114,auVar105,local_480);
            auVar117 = vfmadd231ps_avx512vl(auVar117,local_160,auVar105);
            auVar105 = *(undefined1 (*) [32])(lVar25 + 0x222f5dc + lVar93 * 4);
            auVar113 = vfmadd231ps_avx512vl(auVar113,auVar105,auVar196);
            auVar114 = vfmadd231ps_avx512vl(auVar114,auVar105,auVar171);
            auVar105 = vfmadd231ps_avx512vl(auVar117,local_140,auVar105);
            auVar117 = vfmadd231ps_avx512vl(auVar113,auVar106,auVar172);
            auVar113 = vfmadd231ps_avx512vl(auVar114,auVar106,local_340);
            auVar105 = vfmadd231ps_avx512vl(auVar105,local_120,auVar106);
            auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar116,auVar114);
            vandps_avx512vl(auVar115,auVar114);
            auVar106 = vmaxps_avx(auVar114,auVar114);
            vandps_avx512vl(auVar109,auVar114);
            auVar106 = vmaxps_avx(auVar106,auVar114);
            auVar82._4_4_ = fStack_3fc;
            auVar82._0_4_ = local_400;
            auVar82._8_4_ = fStack_3f8;
            auVar82._12_4_ = fStack_3f4;
            auVar82._16_4_ = fStack_3f0;
            auVar82._20_4_ = fStack_3ec;
            auVar82._24_4_ = fStack_3e8;
            auVar82._28_4_ = fStack_3e4;
            uVar86 = vcmpps_avx512vl(auVar106,auVar82,1);
            bVar17 = (bool)((byte)uVar86 & 1);
            auVar130._0_4_ = (float)((uint)bVar17 * auVar112._0_4_ | (uint)!bVar17 * auVar116._0_4_)
            ;
            bVar17 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar130._4_4_ = (float)((uint)bVar17 * auVar112._4_4_ | (uint)!bVar17 * auVar116._4_4_)
            ;
            bVar17 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar130._8_4_ = (float)((uint)bVar17 * auVar112._8_4_ | (uint)!bVar17 * auVar116._8_4_)
            ;
            bVar17 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar130._12_4_ =
                 (float)((uint)bVar17 * auVar112._12_4_ | (uint)!bVar17 * auVar116._12_4_);
            bVar17 = (bool)((byte)(uVar86 >> 4) & 1);
            auVar130._16_4_ =
                 (float)((uint)bVar17 * auVar112._16_4_ | (uint)!bVar17 * auVar116._16_4_);
            bVar17 = (bool)((byte)(uVar86 >> 5) & 1);
            auVar130._20_4_ =
                 (float)((uint)bVar17 * auVar112._20_4_ | (uint)!bVar17 * auVar116._20_4_);
            bVar17 = (bool)((byte)(uVar86 >> 6) & 1);
            auVar130._24_4_ =
                 (float)((uint)bVar17 * auVar112._24_4_ | (uint)!bVar17 * auVar116._24_4_);
            bVar17 = SUB81(uVar86 >> 7,0);
            auVar130._28_4_ = (uint)bVar17 * auVar112._28_4_ | (uint)!bVar17 * auVar116._28_4_;
            bVar17 = (bool)((byte)uVar86 & 1);
            auVar131._0_4_ = (float)((uint)bVar17 * auVar110._0_4_ | (uint)!bVar17 * auVar115._0_4_)
            ;
            bVar17 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar131._4_4_ = (float)((uint)bVar17 * auVar110._4_4_ | (uint)!bVar17 * auVar115._4_4_)
            ;
            bVar17 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar131._8_4_ = (float)((uint)bVar17 * auVar110._8_4_ | (uint)!bVar17 * auVar115._8_4_)
            ;
            bVar17 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar131._12_4_ =
                 (float)((uint)bVar17 * auVar110._12_4_ | (uint)!bVar17 * auVar115._12_4_);
            bVar17 = (bool)((byte)(uVar86 >> 4) & 1);
            auVar131._16_4_ =
                 (float)((uint)bVar17 * auVar110._16_4_ | (uint)!bVar17 * auVar115._16_4_);
            bVar17 = (bool)((byte)(uVar86 >> 5) & 1);
            auVar131._20_4_ =
                 (float)((uint)bVar17 * auVar110._20_4_ | (uint)!bVar17 * auVar115._20_4_);
            bVar17 = (bool)((byte)(uVar86 >> 6) & 1);
            auVar131._24_4_ =
                 (float)((uint)bVar17 * auVar110._24_4_ | (uint)!bVar17 * auVar115._24_4_);
            bVar17 = SUB81(uVar86 >> 7,0);
            auVar131._28_4_ = (uint)bVar17 * auVar110._28_4_ | (uint)!bVar17 * auVar115._28_4_;
            vandps_avx512vl(auVar117,auVar114);
            vandps_avx512vl(auVar113,auVar114);
            auVar106 = vmaxps_avx(auVar131,auVar131);
            vandps_avx512vl(auVar105,auVar114);
            auVar106 = vmaxps_avx(auVar106,auVar131);
            uVar86 = vcmpps_avx512vl(auVar106,auVar82,1);
            bVar17 = (bool)((byte)uVar86 & 1);
            auVar132._0_4_ = (uint)bVar17 * auVar112._0_4_ | (uint)!bVar17 * auVar117._0_4_;
            bVar17 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar132._4_4_ = (uint)bVar17 * auVar112._4_4_ | (uint)!bVar17 * auVar117._4_4_;
            bVar17 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar132._8_4_ = (uint)bVar17 * auVar112._8_4_ | (uint)!bVar17 * auVar117._8_4_;
            bVar17 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar132._12_4_ = (uint)bVar17 * auVar112._12_4_ | (uint)!bVar17 * auVar117._12_4_;
            bVar17 = (bool)((byte)(uVar86 >> 4) & 1);
            auVar132._16_4_ = (uint)bVar17 * auVar112._16_4_ | (uint)!bVar17 * auVar117._16_4_;
            bVar17 = (bool)((byte)(uVar86 >> 5) & 1);
            auVar132._20_4_ = (uint)bVar17 * auVar112._20_4_ | (uint)!bVar17 * auVar117._20_4_;
            bVar17 = (bool)((byte)(uVar86 >> 6) & 1);
            auVar132._24_4_ = (uint)bVar17 * auVar112._24_4_ | (uint)!bVar17 * auVar117._24_4_;
            bVar17 = SUB81(uVar86 >> 7,0);
            auVar132._28_4_ = (uint)bVar17 * auVar112._28_4_ | (uint)!bVar17 * auVar117._28_4_;
            bVar17 = (bool)((byte)uVar86 & 1);
            auVar133._0_4_ = (float)((uint)bVar17 * auVar110._0_4_ | (uint)!bVar17 * auVar113._0_4_)
            ;
            bVar17 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar133._4_4_ = (float)((uint)bVar17 * auVar110._4_4_ | (uint)!bVar17 * auVar113._4_4_)
            ;
            bVar17 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar133._8_4_ = (float)((uint)bVar17 * auVar110._8_4_ | (uint)!bVar17 * auVar113._8_4_)
            ;
            bVar17 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar133._12_4_ =
                 (float)((uint)bVar17 * auVar110._12_4_ | (uint)!bVar17 * auVar113._12_4_);
            bVar17 = (bool)((byte)(uVar86 >> 4) & 1);
            auVar133._16_4_ =
                 (float)((uint)bVar17 * auVar110._16_4_ | (uint)!bVar17 * auVar113._16_4_);
            bVar17 = (bool)((byte)(uVar86 >> 5) & 1);
            auVar133._20_4_ =
                 (float)((uint)bVar17 * auVar110._20_4_ | (uint)!bVar17 * auVar113._20_4_);
            bVar17 = (bool)((byte)(uVar86 >> 6) & 1);
            auVar133._24_4_ =
                 (float)((uint)bVar17 * auVar110._24_4_ | (uint)!bVar17 * auVar113._24_4_);
            bVar17 = SUB81(uVar86 >> 7,0);
            auVar133._28_4_ = (uint)bVar17 * auVar110._28_4_ | (uint)!bVar17 * auVar113._28_4_;
            auVar206._8_4_ = 0x80000000;
            auVar206._0_8_ = 0x8000000080000000;
            auVar206._12_4_ = 0x80000000;
            auVar206._16_4_ = 0x80000000;
            auVar206._20_4_ = 0x80000000;
            auVar206._24_4_ = 0x80000000;
            auVar206._28_4_ = 0x80000000;
            auVar106 = vxorps_avx512vl(auVar132,auVar206);
            auVar113 = auVar223._0_32_;
            auVar105 = vfmadd213ps_avx512vl(auVar130,auVar130,auVar113);
            auVar101 = vfmadd231ps_fma(auVar105,auVar131,auVar131);
            auVar105 = vrsqrt14ps_avx512vl(ZEXT1632(auVar101));
            auVar216._8_4_ = 0xbf000000;
            auVar216._0_8_ = 0xbf000000bf000000;
            auVar216._12_4_ = 0xbf000000;
            auVar216._16_4_ = 0xbf000000;
            auVar216._20_4_ = 0xbf000000;
            auVar216._24_4_ = 0xbf000000;
            auVar216._28_4_ = 0xbf000000;
            fVar175 = auVar105._0_4_;
            fVar180 = auVar105._4_4_;
            fVar174 = auVar105._8_4_;
            fVar179 = auVar105._12_4_;
            fVar193 = auVar105._16_4_;
            fVar194 = auVar105._20_4_;
            fVar195 = auVar105._24_4_;
            auVar61._4_4_ = fVar180 * fVar180 * fVar180 * auVar101._4_4_ * -0.5;
            auVar61._0_4_ = fVar175 * fVar175 * fVar175 * auVar101._0_4_ * -0.5;
            auVar61._8_4_ = fVar174 * fVar174 * fVar174 * auVar101._8_4_ * -0.5;
            auVar61._12_4_ = fVar179 * fVar179 * fVar179 * auVar101._12_4_ * -0.5;
            auVar61._16_4_ = fVar193 * fVar193 * fVar193 * -0.0;
            auVar61._20_4_ = fVar194 * fVar194 * fVar194 * -0.0;
            auVar61._24_4_ = fVar195 * fVar195 * fVar195 * -0.0;
            auVar61._28_4_ = auVar131._28_4_;
            auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar105 = vfmadd231ps_avx512vl(auVar61,auVar117,auVar105);
            auVar62._4_4_ = auVar131._4_4_ * auVar105._4_4_;
            auVar62._0_4_ = auVar131._0_4_ * auVar105._0_4_;
            auVar62._8_4_ = auVar131._8_4_ * auVar105._8_4_;
            auVar62._12_4_ = auVar131._12_4_ * auVar105._12_4_;
            auVar62._16_4_ = auVar131._16_4_ * auVar105._16_4_;
            auVar62._20_4_ = auVar131._20_4_ * auVar105._20_4_;
            auVar62._24_4_ = auVar131._24_4_ * auVar105._24_4_;
            auVar62._28_4_ = 0;
            auVar63._4_4_ = auVar105._4_4_ * -auVar130._4_4_;
            auVar63._0_4_ = auVar105._0_4_ * -auVar130._0_4_;
            auVar63._8_4_ = auVar105._8_4_ * -auVar130._8_4_;
            auVar63._12_4_ = auVar105._12_4_ * -auVar130._12_4_;
            auVar63._16_4_ = auVar105._16_4_ * -auVar130._16_4_;
            auVar63._20_4_ = auVar105._20_4_ * -auVar130._20_4_;
            auVar63._24_4_ = auVar105._24_4_ * -auVar130._24_4_;
            auVar63._28_4_ = auVar131._28_4_;
            auVar116 = vmulps_avx512vl(auVar105,auVar113);
            auVar105 = vfmadd213ps_avx512vl(auVar132,auVar132,auVar113);
            auVar105 = vfmadd231ps_avx512vl(auVar105,auVar133,auVar133);
            auVar115 = vrsqrt14ps_avx512vl(auVar105);
            auVar105 = vmulps_avx512vl(auVar105,auVar216);
            fVar175 = auVar115._0_4_;
            fVar180 = auVar115._4_4_;
            fVar174 = auVar115._8_4_;
            fVar179 = auVar115._12_4_;
            fVar193 = auVar115._16_4_;
            fVar194 = auVar115._20_4_;
            fVar195 = auVar115._24_4_;
            auVar64._4_4_ = fVar180 * fVar180 * fVar180 * auVar105._4_4_;
            auVar64._0_4_ = fVar175 * fVar175 * fVar175 * auVar105._0_4_;
            auVar64._8_4_ = fVar174 * fVar174 * fVar174 * auVar105._8_4_;
            auVar64._12_4_ = fVar179 * fVar179 * fVar179 * auVar105._12_4_;
            auVar64._16_4_ = fVar193 * fVar193 * fVar193 * auVar105._16_4_;
            auVar64._20_4_ = fVar194 * fVar194 * fVar194 * auVar105._20_4_;
            auVar64._24_4_ = fVar195 * fVar195 * fVar195 * auVar105._24_4_;
            auVar64._28_4_ = auVar105._28_4_;
            auVar105 = vfmadd231ps_avx512vl(auVar64,auVar117,auVar115);
            auVar65._4_4_ = auVar133._4_4_ * auVar105._4_4_;
            auVar65._0_4_ = auVar133._0_4_ * auVar105._0_4_;
            auVar65._8_4_ = auVar133._8_4_ * auVar105._8_4_;
            auVar65._12_4_ = auVar133._12_4_ * auVar105._12_4_;
            auVar65._16_4_ = auVar133._16_4_ * auVar105._16_4_;
            auVar65._20_4_ = auVar133._20_4_ * auVar105._20_4_;
            auVar65._24_4_ = auVar133._24_4_ * auVar105._24_4_;
            auVar65._28_4_ = auVar115._28_4_;
            auVar66._4_4_ = auVar105._4_4_ * auVar106._4_4_;
            auVar66._0_4_ = auVar105._0_4_ * auVar106._0_4_;
            auVar66._8_4_ = auVar105._8_4_ * auVar106._8_4_;
            auVar66._12_4_ = auVar105._12_4_ * auVar106._12_4_;
            auVar66._16_4_ = auVar105._16_4_ * auVar106._16_4_;
            auVar66._20_4_ = auVar105._20_4_ * auVar106._20_4_;
            auVar66._24_4_ = auVar105._24_4_ * auVar106._24_4_;
            auVar66._28_4_ = auVar106._28_4_;
            auVar106 = vmulps_avx512vl(auVar105,auVar113);
            auVar101 = vfmadd213ps_fma(auVar62,ZEXT1632(auVar96),auVar111);
            auVar105 = ZEXT1632(auVar96);
            auVar222 = vfmadd213ps_fma(auVar63,auVar105,auVar104);
            auVar117 = vfmadd213ps_avx512vl(auVar116,auVar105,auVar108);
            auVar115 = vfmadd213ps_avx512vl(auVar65,ZEXT1632(auVar97),auVar102);
            auVar11 = vfnmadd213ps_fma(auVar62,auVar105,auVar111);
            auVar109 = ZEXT1632(auVar97);
            auVar7 = vfmadd213ps_fma(auVar66,auVar109,auVar103);
            auVar151 = vfnmadd213ps_fma(auVar63,auVar105,auVar104);
            auVar8 = vfmadd213ps_fma(auVar106,auVar109,auVar107);
            auVar104 = ZEXT1632(auVar96);
            auVar162 = vfnmadd231ps_fma(auVar108,auVar104,auVar116);
            auVar159 = vfnmadd213ps_fma(auVar65,auVar109,auVar102);
            auVar160 = vfnmadd213ps_fma(auVar66,auVar109,auVar103);
            auVar98 = vfnmadd231ps_fma(auVar107,ZEXT1632(auVar97),auVar106);
            auVar107 = vsubps_avx512vl(auVar115,ZEXT1632(auVar11));
            auVar106 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar151));
            auVar105 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar162));
            auVar67._4_4_ = auVar106._4_4_ * auVar162._4_4_;
            auVar67._0_4_ = auVar106._0_4_ * auVar162._0_4_;
            auVar67._8_4_ = auVar106._8_4_ * auVar162._8_4_;
            auVar67._12_4_ = auVar106._12_4_ * auVar162._12_4_;
            auVar67._16_4_ = auVar106._16_4_ * 0.0;
            auVar67._20_4_ = auVar106._20_4_ * 0.0;
            auVar67._24_4_ = auVar106._24_4_ * 0.0;
            auVar67._28_4_ = auVar116._28_4_;
            auVar96 = vfmsub231ps_fma(auVar67,ZEXT1632(auVar151),auVar105);
            auVar68._4_4_ = auVar105._4_4_ * auVar11._4_4_;
            auVar68._0_4_ = auVar105._0_4_ * auVar11._0_4_;
            auVar68._8_4_ = auVar105._8_4_ * auVar11._8_4_;
            auVar68._12_4_ = auVar105._12_4_ * auVar11._12_4_;
            auVar68._16_4_ = auVar105._16_4_ * 0.0;
            auVar68._20_4_ = auVar105._20_4_ * 0.0;
            auVar68._24_4_ = auVar105._24_4_ * 0.0;
            auVar68._28_4_ = auVar105._28_4_;
            auVar9 = vfmsub231ps_fma(auVar68,ZEXT1632(auVar162),auVar107);
            auVar69._4_4_ = auVar151._4_4_ * auVar107._4_4_;
            auVar69._0_4_ = auVar151._0_4_ * auVar107._0_4_;
            auVar69._8_4_ = auVar151._8_4_ * auVar107._8_4_;
            auVar69._12_4_ = auVar151._12_4_ * auVar107._12_4_;
            auVar69._16_4_ = auVar107._16_4_ * 0.0;
            auVar69._20_4_ = auVar107._20_4_ * 0.0;
            auVar69._24_4_ = auVar107._24_4_ * 0.0;
            auVar69._28_4_ = auVar107._28_4_;
            auVar10 = vfmsub231ps_fma(auVar69,ZEXT1632(auVar11),auVar106);
            auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar113,ZEXT1632(auVar9));
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar113,ZEXT1632(auVar96));
            uVar86 = vcmpps_avx512vl(auVar106,auVar113,2);
            bVar95 = (byte)uVar86;
            fVar173 = (float)((uint)(bVar95 & 1) * auVar101._0_4_ |
                             (uint)!(bool)(bVar95 & 1) * auVar159._0_4_);
            bVar17 = (bool)((byte)(uVar86 >> 1) & 1);
            fVar143 = (float)((uint)bVar17 * auVar101._4_4_ | (uint)!bVar17 * auVar159._4_4_);
            bVar17 = (bool)((byte)(uVar86 >> 2) & 1);
            fVar145 = (float)((uint)bVar17 * auVar101._8_4_ | (uint)!bVar17 * auVar159._8_4_);
            bVar17 = (bool)((byte)(uVar86 >> 3) & 1);
            fVar147 = (float)((uint)bVar17 * auVar101._12_4_ | (uint)!bVar17 * auVar159._12_4_);
            auVar109 = ZEXT1632(CONCAT412(fVar147,CONCAT48(fVar145,CONCAT44(fVar143,fVar173))));
            fVar142 = (float)((uint)(bVar95 & 1) * auVar222._0_4_ |
                             (uint)!(bool)(bVar95 & 1) * auVar160._0_4_);
            bVar17 = (bool)((byte)(uVar86 >> 1) & 1);
            fVar144 = (float)((uint)bVar17 * auVar222._4_4_ | (uint)!bVar17 * auVar160._4_4_);
            bVar17 = (bool)((byte)(uVar86 >> 2) & 1);
            fVar146 = (float)((uint)bVar17 * auVar222._8_4_ | (uint)!bVar17 * auVar160._8_4_);
            bVar17 = (bool)((byte)(uVar86 >> 3) & 1);
            fVar148 = (float)((uint)bVar17 * auVar222._12_4_ | (uint)!bVar17 * auVar160._12_4_);
            auVar112 = ZEXT1632(CONCAT412(fVar148,CONCAT48(fVar146,CONCAT44(fVar144,fVar142))));
            auVar134._0_4_ =
                 (float)((uint)(bVar95 & 1) * auVar117._0_4_ |
                        (uint)!(bool)(bVar95 & 1) * auVar98._0_4_);
            bVar17 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar134._4_4_ = (float)((uint)bVar17 * auVar117._4_4_ | (uint)!bVar17 * auVar98._4_4_);
            bVar17 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar134._8_4_ = (float)((uint)bVar17 * auVar117._8_4_ | (uint)!bVar17 * auVar98._8_4_);
            bVar17 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar134._12_4_ =
                 (float)((uint)bVar17 * auVar117._12_4_ | (uint)!bVar17 * auVar98._12_4_);
            fVar175 = (float)((uint)((byte)(uVar86 >> 4) & 1) * auVar117._16_4_);
            auVar134._16_4_ = fVar175;
            fVar180 = (float)((uint)((byte)(uVar86 >> 5) & 1) * auVar117._20_4_);
            auVar134._20_4_ = fVar180;
            fVar174 = (float)((uint)((byte)(uVar86 >> 6) & 1) * auVar117._24_4_);
            auVar134._24_4_ = fVar174;
            iVar1 = (uint)(byte)(uVar86 >> 7) * auVar117._28_4_;
            auVar134._28_4_ = iVar1;
            auVar106 = vblendmps_avx512vl(ZEXT1632(auVar11),auVar115);
            auVar135._0_4_ =
                 (uint)(bVar95 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar95 & 1) * auVar96._0_4_;
            bVar17 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar135._4_4_ = (uint)bVar17 * auVar106._4_4_ | (uint)!bVar17 * auVar96._4_4_;
            bVar17 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar135._8_4_ = (uint)bVar17 * auVar106._8_4_ | (uint)!bVar17 * auVar96._8_4_;
            bVar17 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar135._12_4_ = (uint)bVar17 * auVar106._12_4_ | (uint)!bVar17 * auVar96._12_4_;
            auVar135._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * auVar106._16_4_;
            auVar135._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * auVar106._20_4_;
            auVar135._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * auVar106._24_4_;
            auVar135._28_4_ = (uint)(byte)(uVar86 >> 7) * auVar106._28_4_;
            auVar106 = vblendmps_avx512vl(ZEXT1632(auVar151),ZEXT1632(auVar7));
            auVar136._0_4_ =
                 (float)((uint)(bVar95 & 1) * auVar106._0_4_ |
                        (uint)!(bool)(bVar95 & 1) * auVar101._0_4_);
            bVar17 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar136._4_4_ = (float)((uint)bVar17 * auVar106._4_4_ | (uint)!bVar17 * auVar101._4_4_)
            ;
            bVar17 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar136._8_4_ = (float)((uint)bVar17 * auVar106._8_4_ | (uint)!bVar17 * auVar101._8_4_)
            ;
            bVar17 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar136._12_4_ =
                 (float)((uint)bVar17 * auVar106._12_4_ | (uint)!bVar17 * auVar101._12_4_);
            fVar194 = (float)((uint)((byte)(uVar86 >> 4) & 1) * auVar106._16_4_);
            auVar136._16_4_ = fVar194;
            fVar193 = (float)((uint)((byte)(uVar86 >> 5) & 1) * auVar106._20_4_);
            auVar136._20_4_ = fVar193;
            fVar179 = (float)((uint)((byte)(uVar86 >> 6) & 1) * auVar106._24_4_);
            auVar136._24_4_ = fVar179;
            auVar136._28_4_ = (uint)(byte)(uVar86 >> 7) * auVar106._28_4_;
            auVar106 = vblendmps_avx512vl(ZEXT1632(auVar162),ZEXT1632(auVar8));
            auVar137._0_4_ =
                 (float)((uint)(bVar95 & 1) * auVar106._0_4_ |
                        (uint)!(bool)(bVar95 & 1) * auVar222._0_4_);
            bVar17 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar137._4_4_ = (float)((uint)bVar17 * auVar106._4_4_ | (uint)!bVar17 * auVar222._4_4_)
            ;
            bVar17 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar137._8_4_ = (float)((uint)bVar17 * auVar106._8_4_ | (uint)!bVar17 * auVar222._8_4_)
            ;
            bVar17 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar137._12_4_ =
                 (float)((uint)bVar17 * auVar106._12_4_ | (uint)!bVar17 * auVar222._12_4_);
            fVar178 = (float)((uint)((byte)(uVar86 >> 4) & 1) * auVar106._16_4_);
            auVar137._16_4_ = fVar178;
            fVar195 = (float)((uint)((byte)(uVar86 >> 5) & 1) * auVar106._20_4_);
            auVar137._20_4_ = fVar195;
            fVar161 = (float)((uint)((byte)(uVar86 >> 6) & 1) * auVar106._24_4_);
            auVar137._24_4_ = fVar161;
            iVar2 = (uint)(byte)(uVar86 >> 7) * auVar106._28_4_;
            auVar137._28_4_ = iVar2;
            auVar138._0_4_ =
                 (uint)(bVar95 & 1) * (int)auVar11._0_4_ |
                 (uint)!(bool)(bVar95 & 1) * auVar115._0_4_;
            bVar17 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar138._4_4_ = (uint)bVar17 * (int)auVar11._4_4_ | (uint)!bVar17 * auVar115._4_4_;
            bVar17 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar138._8_4_ = (uint)bVar17 * (int)auVar11._8_4_ | (uint)!bVar17 * auVar115._8_4_;
            bVar17 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar138._12_4_ = (uint)bVar17 * (int)auVar11._12_4_ | (uint)!bVar17 * auVar115._12_4_;
            auVar138._16_4_ = (uint)!(bool)((byte)(uVar86 >> 4) & 1) * auVar115._16_4_;
            auVar138._20_4_ = (uint)!(bool)((byte)(uVar86 >> 5) & 1) * auVar115._20_4_;
            auVar138._24_4_ = (uint)!(bool)((byte)(uVar86 >> 6) & 1) * auVar115._24_4_;
            auVar138._28_4_ = (uint)!SUB81(uVar86 >> 7,0) * auVar115._28_4_;
            bVar17 = (bool)((byte)(uVar86 >> 1) & 1);
            bVar19 = (bool)((byte)(uVar86 >> 2) & 1);
            bVar21 = (bool)((byte)(uVar86 >> 3) & 1);
            bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
            bVar20 = (bool)((byte)(uVar86 >> 2) & 1);
            bVar22 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar115 = vsubps_avx512vl(auVar138,auVar109);
            auVar105 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar151._12_4_ |
                                                     (uint)!bVar21 * auVar7._12_4_,
                                                     CONCAT48((uint)bVar19 * (int)auVar151._8_4_ |
                                                              (uint)!bVar19 * auVar7._8_4_,
                                                              CONCAT44((uint)bVar17 *
                                                                       (int)auVar151._4_4_ |
                                                                       (uint)!bVar17 * auVar7._4_4_,
                                                                       (uint)(bVar95 & 1) *
                                                                       (int)auVar151._0_4_ |
                                                                       (uint)!(bool)(bVar95 & 1) *
                                                                       auVar7._0_4_)))),auVar112);
            auVar117 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar162._12_4_ |
                                                     (uint)!bVar22 * auVar8._12_4_,
                                                     CONCAT48((uint)bVar20 * (int)auVar162._8_4_ |
                                                              (uint)!bVar20 * auVar8._8_4_,
                                                              CONCAT44((uint)bVar18 *
                                                                       (int)auVar162._4_4_ |
                                                                       (uint)!bVar18 * auVar8._4_4_,
                                                                       (uint)(bVar95 & 1) *
                                                                       (int)auVar162._0_4_ |
                                                                       (uint)!(bool)(bVar95 & 1) *
                                                                       auVar8._0_4_)))),auVar134);
            auVar116 = vsubps_avx(auVar109,auVar135);
            auVar107 = vsubps_avx(auVar112,auVar136);
            auVar108 = vsubps_avx(auVar134,auVar137);
            auVar70._4_4_ = auVar117._4_4_ * fVar143;
            auVar70._0_4_ = auVar117._0_4_ * fVar173;
            auVar70._8_4_ = auVar117._8_4_ * fVar145;
            auVar70._12_4_ = auVar117._12_4_ * fVar147;
            auVar70._16_4_ = auVar117._16_4_ * 0.0;
            auVar70._20_4_ = auVar117._20_4_ * 0.0;
            auVar70._24_4_ = auVar117._24_4_ * 0.0;
            auVar70._28_4_ = 0;
            auVar96 = vfmsub231ps_fma(auVar70,auVar134,auVar115);
            auVar177._0_4_ = fVar142 * auVar115._0_4_;
            auVar177._4_4_ = fVar144 * auVar115._4_4_;
            auVar177._8_4_ = fVar146 * auVar115._8_4_;
            auVar177._12_4_ = fVar148 * auVar115._12_4_;
            auVar177._16_4_ = auVar115._16_4_ * 0.0;
            auVar177._20_4_ = auVar115._20_4_ * 0.0;
            auVar177._24_4_ = auVar115._24_4_ * 0.0;
            auVar177._28_4_ = 0;
            auVar101 = vfmsub231ps_fma(auVar177,auVar109,auVar105);
            auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar101),auVar113,ZEXT1632(auVar96));
            auVar191._0_4_ = auVar105._0_4_ * auVar134._0_4_;
            auVar191._4_4_ = auVar105._4_4_ * auVar134._4_4_;
            auVar191._8_4_ = auVar105._8_4_ * auVar134._8_4_;
            auVar191._12_4_ = auVar105._12_4_ * auVar134._12_4_;
            auVar191._16_4_ = auVar105._16_4_ * fVar175;
            auVar191._20_4_ = auVar105._20_4_ * fVar180;
            auVar191._24_4_ = auVar105._24_4_ * fVar174;
            auVar191._28_4_ = 0;
            auVar96 = vfmsub231ps_fma(auVar191,auVar112,auVar117);
            auVar110 = vfmadd231ps_avx512vl(auVar106,auVar113,ZEXT1632(auVar96));
            auVar106 = vmulps_avx512vl(auVar108,auVar135);
            auVar106 = vfmsub231ps_avx512vl(auVar106,auVar116,auVar137);
            auVar71._4_4_ = auVar107._4_4_ * auVar137._4_4_;
            auVar71._0_4_ = auVar107._0_4_ * auVar137._0_4_;
            auVar71._8_4_ = auVar107._8_4_ * auVar137._8_4_;
            auVar71._12_4_ = auVar107._12_4_ * auVar137._12_4_;
            auVar71._16_4_ = auVar107._16_4_ * fVar178;
            auVar71._20_4_ = auVar107._20_4_ * fVar195;
            auVar71._24_4_ = auVar107._24_4_ * fVar161;
            auVar71._28_4_ = iVar2;
            auVar96 = vfmsub231ps_fma(auVar71,auVar136,auVar108);
            auVar192._0_4_ = auVar136._0_4_ * auVar116._0_4_;
            auVar192._4_4_ = auVar136._4_4_ * auVar116._4_4_;
            auVar192._8_4_ = auVar136._8_4_ * auVar116._8_4_;
            auVar192._12_4_ = auVar136._12_4_ * auVar116._12_4_;
            auVar192._16_4_ = fVar194 * auVar116._16_4_;
            auVar192._20_4_ = fVar193 * auVar116._20_4_;
            auVar192._24_4_ = fVar179 * auVar116._24_4_;
            auVar192._28_4_ = 0;
            auVar101 = vfmsub231ps_fma(auVar192,auVar107,auVar135);
            auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar101),auVar113,auVar106);
            auVar111 = vfmadd231ps_avx512vl(auVar106,auVar113,ZEXT1632(auVar96));
            auVar106 = vmaxps_avx(auVar110,auVar111);
            uVar150 = vcmpps_avx512vl(auVar106,auVar113,2);
            local_230 = local_230 & (byte)uVar150;
            auVar218 = ZEXT3264(auVar171);
            if (local_230 == 0) {
LAB_01ea8612:
              local_230 = 0;
            }
            else {
              auVar72._4_4_ = auVar108._4_4_ * auVar105._4_4_;
              auVar72._0_4_ = auVar108._0_4_ * auVar105._0_4_;
              auVar72._8_4_ = auVar108._8_4_ * auVar105._8_4_;
              auVar72._12_4_ = auVar108._12_4_ * auVar105._12_4_;
              auVar72._16_4_ = auVar108._16_4_ * auVar105._16_4_;
              auVar72._20_4_ = auVar108._20_4_ * auVar105._20_4_;
              auVar72._24_4_ = auVar108._24_4_ * auVar105._24_4_;
              auVar72._28_4_ = auVar106._28_4_;
              auVar222 = vfmsub231ps_fma(auVar72,auVar107,auVar117);
              auVar73._4_4_ = auVar117._4_4_ * auVar116._4_4_;
              auVar73._0_4_ = auVar117._0_4_ * auVar116._0_4_;
              auVar73._8_4_ = auVar117._8_4_ * auVar116._8_4_;
              auVar73._12_4_ = auVar117._12_4_ * auVar116._12_4_;
              auVar73._16_4_ = auVar117._16_4_ * auVar116._16_4_;
              auVar73._20_4_ = auVar117._20_4_ * auVar116._20_4_;
              auVar73._24_4_ = auVar117._24_4_ * auVar116._24_4_;
              auVar73._28_4_ = auVar117._28_4_;
              auVar101 = vfmsub231ps_fma(auVar73,auVar115,auVar108);
              auVar74._4_4_ = auVar107._4_4_ * auVar115._4_4_;
              auVar74._0_4_ = auVar107._0_4_ * auVar115._0_4_;
              auVar74._8_4_ = auVar107._8_4_ * auVar115._8_4_;
              auVar74._12_4_ = auVar107._12_4_ * auVar115._12_4_;
              auVar74._16_4_ = auVar107._16_4_ * auVar115._16_4_;
              auVar74._20_4_ = auVar107._20_4_ * auVar115._20_4_;
              auVar74._24_4_ = auVar107._24_4_ * auVar115._24_4_;
              auVar74._28_4_ = auVar107._28_4_;
              auVar7 = vfmsub231ps_fma(auVar74,auVar116,auVar105);
              auVar96 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar101),ZEXT1632(auVar7));
              auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar96),ZEXT1632(auVar222),auVar113);
              auVar105 = vrcp14ps_avx512vl(auVar106);
              auVar35._8_4_ = 0x3f800000;
              auVar35._0_8_ = &DAT_3f8000003f800000;
              auVar35._12_4_ = 0x3f800000;
              auVar35._16_4_ = 0x3f800000;
              auVar35._20_4_ = 0x3f800000;
              auVar35._24_4_ = 0x3f800000;
              auVar35._28_4_ = 0x3f800000;
              auVar117 = vfnmadd213ps_avx512vl(auVar105,auVar106,auVar35);
              auVar96 = vfmadd132ps_fma(auVar117,auVar105,auVar105);
              auVar75._4_4_ = auVar7._4_4_ * auVar134._4_4_;
              auVar75._0_4_ = auVar7._0_4_ * auVar134._0_4_;
              auVar75._8_4_ = auVar7._8_4_ * auVar134._8_4_;
              auVar75._12_4_ = auVar7._12_4_ * auVar134._12_4_;
              auVar75._16_4_ = fVar175 * 0.0;
              auVar75._20_4_ = fVar180 * 0.0;
              auVar75._24_4_ = fVar174 * 0.0;
              auVar75._28_4_ = iVar1;
              auVar101 = vfmadd231ps_fma(auVar75,auVar112,ZEXT1632(auVar101));
              auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar109,ZEXT1632(auVar222));
              fVar180 = auVar96._0_4_;
              fVar174 = auVar96._4_4_;
              fVar179 = auVar96._8_4_;
              fVar193 = auVar96._12_4_;
              auVar105 = ZEXT1632(CONCAT412(auVar101._12_4_ * fVar193,
                                            CONCAT48(auVar101._8_4_ * fVar179,
                                                     CONCAT44(auVar101._4_4_ * fVar174,
                                                              auVar101._0_4_ * fVar180))));
              auVar83._4_4_ = uStack_31c;
              auVar83._0_4_ = local_320;
              auVar83._8_4_ = uStack_318;
              auVar83._12_4_ = uStack_314;
              auVar83._16_4_ = uStack_310;
              auVar83._20_4_ = uStack_30c;
              auVar83._24_4_ = uStack_308;
              auVar83._28_4_ = uStack_304;
              uVar150 = vcmpps_avx512vl(auVar105,auVar83,0xd);
              fVar175 = (ray->super_RayK<1>).tfar;
              auVar36._4_4_ = fVar175;
              auVar36._0_4_ = fVar175;
              auVar36._8_4_ = fVar175;
              auVar36._12_4_ = fVar175;
              auVar36._16_4_ = fVar175;
              auVar36._20_4_ = fVar175;
              auVar36._24_4_ = fVar175;
              auVar36._28_4_ = fVar175;
              uVar24 = vcmpps_avx512vl(auVar105,auVar36,2);
              local_230 = (byte)uVar150 & (byte)uVar24 & local_230;
              if (local_230 == 0) goto LAB_01ea8612;
              uVar150 = vcmpps_avx512vl(auVar106,auVar113,4);
              if ((local_230 & (byte)uVar150) == 0) {
                local_230 = 0;
              }
              else {
                local_230 = local_230 & (byte)uVar150;
                fVar175 = auVar110._0_4_ * fVar180;
                fVar194 = auVar110._4_4_ * fVar174;
                auVar76._4_4_ = fVar194;
                auVar76._0_4_ = fVar175;
                fVar195 = auVar110._8_4_ * fVar179;
                auVar76._8_4_ = fVar195;
                fVar178 = auVar110._12_4_ * fVar193;
                auVar76._12_4_ = fVar178;
                fVar161 = auVar110._16_4_ * 0.0;
                auVar76._16_4_ = fVar161;
                fVar173 = auVar110._20_4_ * 0.0;
                auVar76._20_4_ = fVar173;
                fVar142 = auVar110._24_4_ * 0.0;
                auVar76._24_4_ = fVar142;
                auVar76._28_4_ = auVar110._28_4_;
                fVar180 = auVar111._0_4_ * fVar180;
                fVar174 = auVar111._4_4_ * fVar174;
                auVar77._4_4_ = fVar174;
                auVar77._0_4_ = fVar180;
                fVar179 = auVar111._8_4_ * fVar179;
                auVar77._8_4_ = fVar179;
                fVar193 = auVar111._12_4_ * fVar193;
                auVar77._12_4_ = fVar193;
                fVar143 = auVar111._16_4_ * 0.0;
                auVar77._16_4_ = fVar143;
                fVar144 = auVar111._20_4_ * 0.0;
                auVar77._20_4_ = fVar144;
                fVar145 = auVar111._24_4_ * 0.0;
                auVar77._24_4_ = fVar145;
                auVar77._28_4_ = auVar111._28_4_;
                auVar199._8_4_ = 0x3f800000;
                auVar199._0_8_ = &DAT_3f8000003f800000;
                auVar199._12_4_ = 0x3f800000;
                auVar199._16_4_ = 0x3f800000;
                auVar199._20_4_ = 0x3f800000;
                auVar199._24_4_ = 0x3f800000;
                auVar199._28_4_ = 0x3f800000;
                auVar106 = vsubps_avx(auVar199,auVar76);
                local_4e0._0_4_ =
                     (uint)(bVar95 & 1) * (int)fVar175 | (uint)!(bool)(bVar95 & 1) * auVar106._0_4_;
                bVar17 = (bool)((byte)(uVar86 >> 1) & 1);
                local_4e0._4_4_ = (uint)bVar17 * (int)fVar194 | (uint)!bVar17 * auVar106._4_4_;
                bVar17 = (bool)((byte)(uVar86 >> 2) & 1);
                local_4e0._8_4_ = (uint)bVar17 * (int)fVar195 | (uint)!bVar17 * auVar106._8_4_;
                bVar17 = (bool)((byte)(uVar86 >> 3) & 1);
                local_4e0._12_4_ = (uint)bVar17 * (int)fVar178 | (uint)!bVar17 * auVar106._12_4_;
                bVar17 = (bool)((byte)(uVar86 >> 4) & 1);
                local_4e0._16_4_ = (uint)bVar17 * (int)fVar161 | (uint)!bVar17 * auVar106._16_4_;
                bVar17 = (bool)((byte)(uVar86 >> 5) & 1);
                local_4e0._20_4_ = (uint)bVar17 * (int)fVar173 | (uint)!bVar17 * auVar106._20_4_;
                bVar17 = (bool)((byte)(uVar86 >> 6) & 1);
                local_4e0._24_4_ = (uint)bVar17 * (int)fVar142 | (uint)!bVar17 * auVar106._24_4_;
                bVar17 = SUB81(uVar86 >> 7,0);
                local_4e0._28_4_ = (uint)bVar17 * auVar110._28_4_ | (uint)!bVar17 * auVar106._28_4_;
                auVar106 = vsubps_avx(auVar199,auVar77);
                bVar17 = (bool)((byte)(uVar86 >> 1) & 1);
                bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
                bVar19 = (bool)((byte)(uVar86 >> 3) & 1);
                bVar20 = (bool)((byte)(uVar86 >> 4) & 1);
                bVar21 = (bool)((byte)(uVar86 >> 5) & 1);
                bVar22 = (bool)((byte)(uVar86 >> 6) & 1);
                bVar23 = SUB81(uVar86 >> 7,0);
                local_1c0._4_4_ = (uint)bVar17 * (int)fVar174 | (uint)!bVar17 * auVar106._4_4_;
                local_1c0._0_4_ =
                     (uint)(bVar95 & 1) * (int)fVar180 | (uint)!(bool)(bVar95 & 1) * auVar106._0_4_;
                local_1c0._8_4_ = (uint)bVar18 * (int)fVar179 | (uint)!bVar18 * auVar106._8_4_;
                local_1c0._12_4_ = (uint)bVar19 * (int)fVar193 | (uint)!bVar19 * auVar106._12_4_;
                local_1c0._16_4_ = (uint)bVar20 * (int)fVar143 | (uint)!bVar20 * auVar106._16_4_;
                local_1c0._20_4_ = (uint)bVar21 * (int)fVar144 | (uint)!bVar21 * auVar106._20_4_;
                local_1c0._24_4_ = (uint)bVar22 * (int)fVar145 | (uint)!bVar22 * auVar106._24_4_;
                local_1c0._28_4_ = (uint)bVar23 * auVar111._28_4_ | (uint)!bVar23 * auVar106._28_4_;
                local_500 = auVar105;
              }
            }
            auVar227 = ZEXT3264(local_560);
            if (local_230 != 0) {
              auVar106 = vsubps_avx(ZEXT1632(auVar97),auVar104);
              auVar96 = vfmadd213ps_fma(auVar106,local_4e0,auVar104);
              fVar175 = local_5e8->depth_scale;
              auVar37._4_4_ = fVar175;
              auVar37._0_4_ = fVar175;
              auVar37._8_4_ = fVar175;
              auVar37._12_4_ = fVar175;
              auVar37._16_4_ = fVar175;
              auVar37._20_4_ = fVar175;
              auVar37._24_4_ = fVar175;
              auVar37._28_4_ = fVar175;
              auVar106 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar96._12_4_ + auVar96._12_4_,
                                                            CONCAT48(auVar96._8_4_ + auVar96._8_4_,
                                                                     CONCAT44(auVar96._4_4_ +
                                                                              auVar96._4_4_,
                                                                              auVar96._0_4_ +
                                                                              auVar96._0_4_)))),
                                         auVar37);
              uVar150 = vcmpps_avx512vl(local_500,auVar106,6);
              local_230 = local_230 & (byte)uVar150;
              uVar94 = (uint)local_230;
              if (local_230 != 0) {
                auVar155._8_4_ = 0xbf800000;
                auVar155._0_8_ = 0xbf800000bf800000;
                auVar155._12_4_ = 0xbf800000;
                auVar155._16_4_ = 0xbf800000;
                auVar155._20_4_ = 0xbf800000;
                auVar155._24_4_ = 0xbf800000;
                auVar155._28_4_ = 0xbf800000;
                auVar38._8_4_ = 0x40000000;
                auVar38._0_8_ = 0x4000000040000000;
                auVar38._12_4_ = 0x40000000;
                auVar38._16_4_ = 0x40000000;
                auVar38._20_4_ = 0x40000000;
                auVar38._24_4_ = 0x40000000;
                auVar38._28_4_ = 0x40000000;
                local_1c0 = vfmadd132ps_avx512vl(local_1c0,auVar155,auVar38);
                local_2e0 = local_4e0;
                auVar106 = local_1c0;
                local_2c0 = local_1c0;
                local_2a0 = local_500;
                local_280 = (int)lVar93;
                local_27c = iVar13;
                local_270 = local_5b0._0_8_;
                uStack_268 = local_5b0._8_8_;
                local_260 = local_510._0_8_;
                uStack_258 = local_510._8_8_;
                local_250 = local_520._0_8_;
                uStack_248 = local_520._8_8_;
                local_240 = local_530;
                uStack_238 = uStack_528;
                pGVar91 = (context->scene->geometries).items[local_5f8].ptr;
                local_1c0 = auVar106;
                if ((pGVar91->mask & (ray->super_RayK<1>).mask) != 0) {
                  auVar96 = vcvtsi2ss_avx512f(auVar217._0_16_,(int)lVar93);
                  fVar175 = auVar96._0_4_;
                  local_220[0] = (fVar175 + local_4e0._0_4_ + 0.0) * (float)local_300._0_4_;
                  local_220[1] = (fVar175 + local_4e0._4_4_ + 1.0) * (float)local_300._4_4_;
                  local_220[2] = (fVar175 + local_4e0._8_4_ + 2.0) * fStack_2f8;
                  local_220[3] = (fVar175 + local_4e0._12_4_ + 3.0) * fStack_2f4;
                  fStack_210 = (fVar175 + local_4e0._16_4_ + 4.0) * fStack_2f0;
                  fStack_20c = (fVar175 + local_4e0._20_4_ + 5.0) * fStack_2ec;
                  fStack_208 = (fVar175 + local_4e0._24_4_ + 6.0) * fStack_2e8;
                  fStack_204 = fVar175 + local_4e0._28_4_ + 7.0;
                  local_200 = local_1c0._0_8_;
                  uStack_1f8 = local_1c0._8_8_;
                  uStack_1f0 = local_1c0._16_8_;
                  uStack_1e8 = local_1c0._24_8_;
                  local_1e0 = local_500;
                  auVar156._8_4_ = 0x7f800000;
                  auVar156._0_8_ = 0x7f8000007f800000;
                  auVar156._12_4_ = 0x7f800000;
                  auVar156._16_4_ = 0x7f800000;
                  auVar156._20_4_ = 0x7f800000;
                  auVar156._24_4_ = 0x7f800000;
                  auVar156._28_4_ = 0x7f800000;
                  auVar105 = vblendmps_avx512vl(auVar156,local_500);
                  auVar139._0_4_ =
                       (uint)(local_230 & 1) * auVar105._0_4_ |
                       (uint)!(bool)(local_230 & 1) * 0x7f800000;
                  bVar17 = (bool)(local_230 >> 1 & 1);
                  auVar139._4_4_ = (uint)bVar17 * auVar105._4_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)(local_230 >> 2 & 1);
                  auVar139._8_4_ = (uint)bVar17 * auVar105._8_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)(local_230 >> 3 & 1);
                  auVar139._12_4_ = (uint)bVar17 * auVar105._12_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)(local_230 >> 4 & 1);
                  auVar139._16_4_ = (uint)bVar17 * auVar105._16_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)(local_230 >> 5 & 1);
                  auVar139._20_4_ = (uint)bVar17 * auVar105._20_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)(local_230 >> 6 & 1);
                  auVar139._24_4_ = (uint)bVar17 * auVar105._24_4_ | (uint)!bVar17 * 0x7f800000;
                  auVar139._28_4_ =
                       (uint)(local_230 >> 7) * auVar105._28_4_ |
                       (uint)!(bool)(local_230 >> 7) * 0x7f800000;
                  auVar105 = vshufps_avx(auVar139,auVar139,0xb1);
                  auVar105 = vminps_avx(auVar139,auVar105);
                  auVar117 = vshufpd_avx(auVar105,auVar105,5);
                  auVar105 = vminps_avx(auVar105,auVar117);
                  auVar117 = vpermpd_avx2(auVar105,0x4e);
                  auVar105 = vminps_avx(auVar105,auVar117);
                  uVar150 = vcmpps_avx512vl(auVar139,auVar105,0);
                  bVar85 = (byte)uVar150 & local_230;
                  bVar95 = local_230;
                  if (bVar85 != 0) {
                    bVar95 = bVar85;
                  }
                  uVar89 = 0;
                  for (uVar88 = (uint)bVar95; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x80000000)
                  {
                    uVar89 = uVar89 + 1;
                  }
                  uVar86 = (ulong)uVar89;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar91->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar175 = local_220[uVar86];
                    fVar180 = *(float *)((long)&local_200 + uVar86 * 4);
                    fVar174 = 1.0 - fVar175;
                    auVar27._8_4_ = 0x80000000;
                    auVar27._0_8_ = 0x8000000080000000;
                    auVar27._12_4_ = 0x80000000;
                    auVar101 = vxorps_avx512vl(ZEXT416((uint)fVar174),auVar27);
                    auVar96 = ZEXT416((uint)(fVar175 * fVar174 * 4.0));
                    auVar97 = vfnmsub213ss_fma(ZEXT416((uint)fVar175),ZEXT416((uint)fVar175),auVar96
                                              );
                    auVar96 = vfmadd213ss_fma(ZEXT416((uint)fVar174),ZEXT416((uint)fVar174),auVar96)
                    ;
                    fVar174 = fVar174 * auVar101._0_4_ * 0.5;
                    fVar179 = auVar97._0_4_ * 0.5;
                    fVar193 = auVar96._0_4_ * 0.5;
                    fVar194 = fVar175 * fVar175 * 0.5;
                    auVar183._0_4_ = fVar194 * (float)local_530._0_4_;
                    auVar183._4_4_ = fVar194 * (float)local_530._4_4_;
                    auVar183._8_4_ = fVar194 * (float)uStack_528;
                    auVar183._12_4_ = fVar194 * uStack_528._4_4_;
                    auVar165._4_4_ = fVar193;
                    auVar165._0_4_ = fVar193;
                    auVar165._8_4_ = fVar193;
                    auVar165._12_4_ = fVar193;
                    auVar96 = vfmadd132ps_fma(auVar165,auVar183,local_520);
                    auVar184._4_4_ = fVar179;
                    auVar184._0_4_ = fVar179;
                    auVar184._8_4_ = fVar179;
                    auVar184._12_4_ = fVar179;
                    auVar96 = vfmadd132ps_fma(auVar184,auVar96,local_510);
                    auVar166._4_4_ = fVar174;
                    auVar166._0_4_ = fVar174;
                    auVar166._8_4_ = fVar174;
                    auVar166._12_4_ = fVar174;
                    (ray->super_RayK<1>).tfar = *(float *)(local_1e0 + uVar86 * 4);
                    auVar96 = vfmadd132ps_fma(auVar166,auVar96,local_5b0);
                    uVar150 = vmovlps_avx(auVar96);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar150;
                    fVar174 = (float)vextractps_avx(auVar96,2);
                    (ray->Ng).field_0.field_0.z = fVar174;
                    ray->u = fVar175;
                    ray->v = fVar180;
                    ray->primID = (uint)local_5f0;
                    ray->geomID = (uint)local_5f8;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                  else {
                    local_430 = local_510._0_8_;
                    uStack_428 = local_510._8_8_;
                    local_440 = local_520._0_4_;
                    fStack_43c = local_520._4_4_;
                    fStack_438 = local_520._8_4_;
                    fStack_434 = local_520._12_4_;
                    _local_540 = _local_530;
                    local_568 = pGVar91;
                    local_180 = vmovdqa64_avx512vl(auVar212._0_32_);
                    do {
                      auVar222 = auVar223._0_16_;
                      local_594 = local_220[uVar86];
                      local_590 = *(undefined4 *)((long)&local_200 + uVar86 * 4);
                      local_420 = (ray->super_RayK<1>).tfar;
                      (ray->super_RayK<1>).tfar = *(float *)(local_1e0 + uVar86 * 4);
                      local_5e0.context = context->user;
                      fVar175 = 1.0 - local_594;
                      auVar28._8_4_ = 0x80000000;
                      auVar28._0_8_ = 0x8000000080000000;
                      auVar28._12_4_ = 0x80000000;
                      auVar101 = vxorps_avx512vl(ZEXT416((uint)fVar175),auVar28);
                      auVar96 = ZEXT416((uint)(local_594 * fVar175 * 4.0));
                      auVar97 = vfnmsub213ss_fma(ZEXT416((uint)local_594),ZEXT416((uint)local_594),
                                                 auVar96);
                      auVar96 = vfmadd213ss_fma(ZEXT416((uint)fVar175),ZEXT416((uint)fVar175),
                                                auVar96);
                      fVar175 = fVar175 * auVar101._0_4_ * 0.5;
                      fVar180 = auVar97._0_4_ * 0.5;
                      fVar174 = auVar96._0_4_ * 0.5;
                      fVar179 = local_594 * local_594 * 0.5;
                      auVar185._0_4_ = fVar179 * (float)local_540._0_4_;
                      auVar185._4_4_ = fVar179 * (float)local_540._4_4_;
                      auVar185._8_4_ = fVar179 * fStack_538;
                      auVar185._12_4_ = fVar179 * fStack_534;
                      auVar167._4_4_ = fVar174;
                      auVar167._0_4_ = fVar174;
                      auVar167._8_4_ = fVar174;
                      auVar167._12_4_ = fVar174;
                      auVar78._4_4_ = fStack_43c;
                      auVar78._0_4_ = local_440;
                      auVar78._8_4_ = fStack_438;
                      auVar78._12_4_ = fStack_434;
                      auVar96 = vfmadd132ps_fma(auVar167,auVar185,auVar78);
                      auVar186._4_4_ = fVar180;
                      auVar186._0_4_ = fVar180;
                      auVar186._8_4_ = fVar180;
                      auVar186._12_4_ = fVar180;
                      auVar79._8_8_ = uStack_428;
                      auVar79._0_8_ = local_430;
                      auVar96 = vfmadd132ps_fma(auVar186,auVar96,auVar79);
                      auVar168._4_4_ = fVar175;
                      auVar168._0_4_ = fVar175;
                      auVar168._8_4_ = fVar175;
                      auVar168._12_4_ = fVar175;
                      auVar96 = vfmadd132ps_fma(auVar168,auVar96,local_5b0);
                      local_5a0 = vmovlps_avx(auVar96);
                      local_598 = vextractps_avx(auVar96,2);
                      local_58c = (int)local_5f0;
                      local_588 = (int)local_5f8;
                      local_584 = (local_5e0.context)->instID[0];
                      local_580 = (local_5e0.context)->instPrimID[0];
                      local_5fc = -1;
                      local_5e0.valid = &local_5fc;
                      local_5e0.geometryUserPtr = pGVar91->userPtr;
                      local_5e0.ray = (RTCRayN *)ray;
                      local_5e0.hit = (RTCHitN *)&local_5a0;
                      local_5e0.N = 1;
                      if (pGVar91->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01ea88a0:
                        auVar96 = auVar223._0_16_;
                        p_Var16 = context->args->filter;
                        if (p_Var16 != (RTCFilterFunctionN)0x0) {
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar91->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var16)(&local_5e0);
                            auVar106 = vmovdqa64_avx512vl(local_180);
                            auVar212 = ZEXT3264(auVar106);
                            auVar226 = ZEXT3264(local_4c0);
                            auVar225 = ZEXT3264(local_4a0);
                            auVar224 = ZEXT3264(local_480);
                            auVar227 = ZEXT3264(local_560);
                            auVar218 = ZEXT3264(local_3a0);
                            auVar221 = ZEXT3264(local_380);
                            auVar220 = ZEXT3264(local_340);
                            auVar219 = ZEXT3264(local_360);
                            auVar96 = vxorps_avx512vl(auVar96,auVar96);
                            auVar223 = ZEXT1664(auVar96);
                            pGVar91 = local_568;
                          }
                          if (*local_5e0.valid == 0) goto LAB_01ea8999;
                        }
                        (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).components[0] =
                             *(float *)local_5e0.hit;
                        (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_5e0.hit + 4);
                        (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_5e0.hit + 8);
                        *(float *)((long)local_5e0.ray + 0x3c) = *(float *)(local_5e0.hit + 0xc);
                        *(float *)((long)local_5e0.ray + 0x40) = *(float *)(local_5e0.hit + 0x10);
                        *(float *)((long)local_5e0.ray + 0x44) = *(float *)(local_5e0.hit + 0x14);
                        *(float *)((long)local_5e0.ray + 0x48) = *(float *)(local_5e0.hit + 0x18);
                        *(float *)((long)local_5e0.ray + 0x4c) = *(float *)(local_5e0.hit + 0x1c);
                        *(float *)((long)local_5e0.ray + 0x50) = *(float *)(local_5e0.hit + 0x20);
                      }
                      else {
                        (*pGVar91->intersectionFilterN)(&local_5e0);
                        auVar106 = vmovdqa64_avx512vl(local_180);
                        auVar212 = ZEXT3264(auVar106);
                        auVar226 = ZEXT3264(local_4c0);
                        auVar225 = ZEXT3264(local_4a0);
                        auVar224 = ZEXT3264(local_480);
                        auVar227 = ZEXT3264(local_560);
                        auVar218 = ZEXT3264(local_3a0);
                        auVar221 = ZEXT3264(local_380);
                        auVar220 = ZEXT3264(local_340);
                        auVar219 = ZEXT3264(local_360);
                        auVar96 = vxorps_avx512vl(auVar222,auVar222);
                        auVar223 = ZEXT1664(auVar96);
                        pGVar91 = local_568;
                        if (*local_5e0.valid != 0) goto LAB_01ea88a0;
LAB_01ea8999:
                        (ray->super_RayK<1>).tfar = local_420;
                      }
                      bVar85 = ~(byte)(1 << ((uint)uVar86 & 0x1f)) & (byte)uVar94;
                      fVar175 = (ray->super_RayK<1>).tfar;
                      auVar39._4_4_ = fVar175;
                      auVar39._0_4_ = fVar175;
                      auVar39._8_4_ = fVar175;
                      auVar39._12_4_ = fVar175;
                      auVar39._16_4_ = fVar175;
                      auVar39._20_4_ = fVar175;
                      auVar39._24_4_ = fVar175;
                      auVar39._28_4_ = fVar175;
                      uVar150 = vcmpps_avx512vl(local_500,auVar39,2);
                      bVar95 = bVar85 & (byte)uVar150;
                      uVar94 = (uint)bVar95;
                      if ((bVar85 & (byte)uVar150) != 0) {
                        auVar157._8_4_ = 0x7f800000;
                        auVar157._0_8_ = 0x7f8000007f800000;
                        auVar157._12_4_ = 0x7f800000;
                        auVar157._16_4_ = 0x7f800000;
                        auVar157._20_4_ = 0x7f800000;
                        auVar157._24_4_ = 0x7f800000;
                        auVar157._28_4_ = 0x7f800000;
                        auVar106 = vblendmps_avx512vl(auVar157,local_500);
                        auVar140._0_4_ =
                             (uint)(bVar95 & 1) * auVar106._0_4_ |
                             (uint)!(bool)(bVar95 & 1) * 0x7f800000;
                        bVar17 = (bool)(bVar95 >> 1 & 1);
                        auVar140._4_4_ = (uint)bVar17 * auVar106._4_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar95 >> 2 & 1);
                        auVar140._8_4_ = (uint)bVar17 * auVar106._8_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar95 >> 3 & 1);
                        auVar140._12_4_ =
                             (uint)bVar17 * auVar106._12_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar95 >> 4 & 1);
                        auVar140._16_4_ =
                             (uint)bVar17 * auVar106._16_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar95 >> 5 & 1);
                        auVar140._20_4_ =
                             (uint)bVar17 * auVar106._20_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar95 >> 6 & 1);
                        auVar140._24_4_ =
                             (uint)bVar17 * auVar106._24_4_ | (uint)!bVar17 * 0x7f800000;
                        auVar140._28_4_ =
                             (uint)(bVar95 >> 7) * auVar106._28_4_ |
                             (uint)!(bool)(bVar95 >> 7) * 0x7f800000;
                        auVar106 = vshufps_avx(auVar140,auVar140,0xb1);
                        auVar106 = vminps_avx(auVar140,auVar106);
                        auVar105 = vshufpd_avx(auVar106,auVar106,5);
                        auVar106 = vminps_avx(auVar106,auVar105);
                        auVar105 = vpermpd_avx2(auVar106,0x4e);
                        auVar106 = vminps_avx(auVar106,auVar105);
                        uVar150 = vcmpps_avx512vl(auVar140,auVar106,0);
                        bVar85 = (byte)uVar150 & bVar95;
                        uVar89 = uVar94;
                        if (bVar85 != 0) {
                          uVar89 = (uint)bVar85;
                        }
                        uVar88 = 0;
                        for (; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x80000000) {
                          uVar88 = uVar88 + 1;
                        }
                        uVar86 = (ulong)uVar88;
                      }
                    } while (bVar95 != 0);
                  }
                }
              }
            }
          }
          lVar93 = lVar93 + 8;
          auVar217 = auVar218;
        } while ((int)lVar93 < iVar13);
      }
      fVar175 = (ray->super_RayK<1>).tfar;
      auVar34._4_4_ = fVar175;
      auVar34._0_4_ = fVar175;
      auVar34._8_4_ = fVar175;
      auVar34._12_4_ = fVar175;
      auVar34._16_4_ = fVar175;
      auVar34._20_4_ = fVar175;
      auVar34._24_4_ = fVar175;
      auVar34._28_4_ = fVar175;
      uVar150 = vcmpps_avx512vl(local_80,auVar34,2);
      uVar94 = (uint)uVar92 & (uint)uVar92 + 0xff & (uint)uVar150;
      uVar92 = (ulong)uVar94;
    } while (uVar94 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }